

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::sse2::CurveNiIntersector1<4>::
     intersect_t<embree::sse2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,4>,embree::sse2::Intersect1EpilogMU<4,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  Primitive *pPVar3;
  undefined1 (*pauVar4) [12];
  Primitive PVar5;
  int iVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined6 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  int iVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  long lVar33;
  undefined1 *puVar34;
  RayHit *pRVar35;
  ulong uVar36;
  RTCFilterFunctionN p_Var37;
  RTCFilterFunctionN extraout_RDX;
  RTCFilterFunctionN extraout_RDX_00;
  RTCFilterFunctionN extraout_RDX_01;
  RTCFilterFunctionN extraout_RDX_02;
  long lVar38;
  Geometry *pGVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  short sVar49;
  float fVar50;
  float fVar85;
  float fVar86;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar87;
  float fVar108;
  float fVar109;
  vfloat4 v;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar110;
  float fVar111;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  float fVar139;
  float fVar140;
  vfloat4 v_1;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar141;
  float fVar149;
  float fVar150;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar160;
  float fVar161;
  undefined1 auVar152 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar170;
  float fVar171;
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar172;
  float fVar173;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar174;
  float fVar175;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  float fVar197;
  float fVar198;
  float fVar204;
  float fVar205;
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar209;
  float fVar210;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar224;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar239;
  float fVar240;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_46c [20];
  undefined1 local_458 [16];
  undefined8 local_448;
  float fStack_440;
  anon_union_12_2_4062524c_for_Vec3<float>_1 aStack_43c;
  float fStack_430;
  float fStack_42c;
  ulong local_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  RayQueryContext *local_3e8;
  ulong local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  Precalculations *local_378;
  Primitive *local_370;
  RTCFilterFunctionNArguments local_368;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 local_248;
  float local_240;
  float local_23c;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  uint local_22c;
  uint local_228;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  uint local_168;
  int local_164;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  float local_108 [4];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 uVar83;
  undefined2 uVar84;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  
  PVar5 = prim[1];
  uVar36 = (ulong)(byte)PVar5;
  pPVar3 = prim + uVar36 * 0x19 + 6;
  fVar109 = *(float *)(pPVar3 + 0xc);
  fVar125 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar3) * fVar109;
  fVar139 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar3 + 4)) * fVar109;
  fVar140 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar3 + 8)) * fVar109;
  fVar87 = fVar109 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar108 = fVar109 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar109 = fVar109 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar32 = *(undefined4 *)(prim + uVar36 * 4 + 6);
  uVar83 = (undefined1)((uint)uVar32 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar32 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar32));
  uVar83 = (undefined1)((uint)uVar32 >> 8);
  uVar10 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar83),uVar83);
  sVar49 = CONCAT11((char)uVar32,(char)uVar32);
  uVar42 = CONCAT62(uVar10,sVar49);
  auVar51._8_4_ = 0;
  auVar51._0_8_ = uVar42;
  auVar51._12_2_ = uVar84;
  auVar51._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar208._12_4_ = auVar51._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar42;
  auVar208._10_2_ = uVar84;
  auVar61._10_6_ = auVar208._10_6_;
  auVar61._8_2_ = uVar84;
  auVar61._0_8_ = uVar42;
  uVar84 = (undefined2)uVar10;
  auVar11._4_8_ = auVar61._8_8_;
  auVar11._2_2_ = uVar84;
  auVar11._0_2_ = uVar84;
  fVar110 = (float)((int)sVar49 >> 8);
  fVar119 = (float)(auVar11._0_4_ >> 0x18);
  fVar121 = (float)(auVar61._8_4_ >> 0x18);
  uVar32 = *(undefined4 *)(prim + uVar36 * 5 + 6);
  uVar83 = (undefined1)((uint)uVar32 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar32 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar32));
  uVar83 = (undefined1)((uint)uVar32 >> 8);
  uVar10 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar83),uVar83);
  sVar49 = CONCAT11((char)uVar32,(char)uVar32);
  uVar42 = CONCAT62(uVar10,sVar49);
  auVar54._8_4_ = 0;
  auVar54._0_8_ = uVar42;
  auVar54._12_2_ = uVar84;
  auVar54._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar53._12_4_ = auVar54._12_4_;
  auVar53._8_2_ = 0;
  auVar53._0_8_ = uVar42;
  auVar53._10_2_ = uVar84;
  auVar52._10_6_ = auVar53._10_6_;
  auVar52._8_2_ = uVar84;
  auVar52._0_8_ = uVar42;
  uVar84 = (undefined2)uVar10;
  auVar12._4_8_ = auVar52._8_8_;
  auVar12._2_2_ = uVar84;
  auVar12._0_2_ = uVar84;
  fVar141 = (float)((int)sVar49 >> 8);
  fVar149 = (float)(auVar12._0_4_ >> 0x18);
  fVar150 = (float)(auVar52._8_4_ >> 0x18);
  uVar32 = *(undefined4 *)(prim + uVar36 * 6 + 6);
  uVar83 = (undefined1)((uint)uVar32 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar32 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar32));
  uVar83 = (undefined1)((uint)uVar32 >> 8);
  uVar10 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar83),uVar83);
  sVar49 = CONCAT11((char)uVar32,(char)uVar32);
  uVar42 = CONCAT62(uVar10,sVar49);
  auVar57._8_4_ = 0;
  auVar57._0_8_ = uVar42;
  auVar57._12_2_ = uVar84;
  auVar57._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar56._12_4_ = auVar57._12_4_;
  auVar56._8_2_ = 0;
  auVar56._0_8_ = uVar42;
  auVar56._10_2_ = uVar84;
  auVar55._10_6_ = auVar56._10_6_;
  auVar55._8_2_ = uVar84;
  auVar55._0_8_ = uVar42;
  uVar84 = (undefined2)uVar10;
  auVar13._4_8_ = auVar55._8_8_;
  auVar13._2_2_ = uVar84;
  auVar13._0_2_ = uVar84;
  fVar151 = (float)((int)sVar49 >> 8);
  fVar160 = (float)(auVar13._0_4_ >> 0x18);
  fVar161 = (float)(auVar55._8_4_ >> 0x18);
  uVar32 = *(undefined4 *)(prim + uVar36 * 0xb + 6);
  uVar83 = (undefined1)((uint)uVar32 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar32 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar32));
  uVar83 = (undefined1)((uint)uVar32 >> 8);
  uVar10 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar83),uVar83);
  sVar49 = CONCAT11((char)uVar32,(char)uVar32);
  uVar42 = CONCAT62(uVar10,sVar49);
  auVar60._8_4_ = 0;
  auVar60._0_8_ = uVar42;
  auVar60._12_2_ = uVar84;
  auVar60._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar42;
  auVar59._10_2_ = uVar84;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._8_2_ = uVar84;
  auVar58._0_8_ = uVar42;
  uVar84 = (undefined2)uVar10;
  auVar14._4_8_ = auVar58._8_8_;
  auVar14._2_2_ = uVar84;
  auVar14._0_2_ = uVar84;
  fVar50 = (float)((int)sVar49 >> 8);
  fVar85 = (float)(auVar14._0_4_ >> 0x18);
  fVar86 = (float)(auVar58._8_4_ >> 0x18);
  uVar32 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar83 = (undefined1)((uint)uVar32 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar32 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar32));
  uVar83 = (undefined1)((uint)uVar32 >> 8);
  uVar10 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar83),uVar83);
  sVar49 = CONCAT11((char)uVar32,(char)uVar32);
  uVar42 = CONCAT62(uVar10,sVar49);
  auVar165._8_4_ = 0;
  auVar165._0_8_ = uVar42;
  auVar165._12_2_ = uVar84;
  auVar165._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar164._12_4_ = auVar165._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar42;
  auVar164._10_2_ = uVar84;
  auVar163._10_6_ = auVar164._10_6_;
  auVar163._8_2_ = uVar84;
  auVar163._0_8_ = uVar42;
  uVar84 = (undefined2)uVar10;
  auVar15._4_8_ = auVar163._8_8_;
  auVar15._2_2_ = uVar84;
  auVar15._0_2_ = uVar84;
  fVar162 = (float)((int)sVar49 >> 8);
  fVar170 = (float)(auVar15._0_4_ >> 0x18);
  fVar171 = (float)(auVar163._8_4_ >> 0x18);
  uVar32 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar36 + 6);
  uVar83 = (undefined1)((uint)uVar32 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar32 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar32));
  uVar83 = (undefined1)((uint)uVar32 >> 8);
  uVar10 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar83),uVar83);
  sVar49 = CONCAT11((char)uVar32,(char)uVar32);
  uVar42 = CONCAT62(uVar10,sVar49);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar42;
  auVar178._12_2_ = uVar84;
  auVar178._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar42;
  auVar177._10_2_ = uVar84;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar84;
  auVar176._0_8_ = uVar42;
  uVar84 = (undefined2)uVar10;
  auVar16._4_8_ = auVar176._8_8_;
  auVar16._2_2_ = uVar84;
  auVar16._0_2_ = uVar84;
  fVar206 = (float)((int)sVar49 >> 8);
  fVar209 = (float)(auVar16._0_4_ >> 0x18);
  fVar210 = (float)(auVar176._8_4_ >> 0x18);
  uVar40 = (ulong)(uint)((int)(uVar36 * 9) * 2);
  uVar32 = *(undefined4 *)(prim + uVar40 + 6);
  uVar83 = (undefined1)((uint)uVar32 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar32 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar32));
  uVar83 = (undefined1)((uint)uVar32 >> 8);
  uVar10 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar83),uVar83);
  sVar49 = CONCAT11((char)uVar32,(char)uVar32);
  uVar42 = CONCAT62(uVar10,sVar49);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar42;
  auVar181._12_2_ = uVar84;
  auVar181._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar42;
  auVar180._10_2_ = uVar84;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar84;
  auVar179._0_8_ = uVar42;
  uVar84 = (undefined2)uVar10;
  auVar17._4_8_ = auVar179._8_8_;
  auVar17._2_2_ = uVar84;
  auVar17._0_2_ = uVar84;
  fVar198 = (float)((int)sVar49 >> 8);
  fVar204 = (float)(auVar17._0_4_ >> 0x18);
  fVar205 = (float)(auVar179._8_4_ >> 0x18);
  uVar32 = *(undefined4 *)(prim + uVar40 + uVar36 + 6);
  uVar83 = (undefined1)((uint)uVar32 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar32 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar32));
  uVar83 = (undefined1)((uint)uVar32 >> 8);
  uVar10 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar83),uVar83);
  sVar49 = CONCAT11((char)uVar32,(char)uVar32);
  uVar42 = CONCAT62(uVar10,sVar49);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar42;
  auVar184._12_2_ = uVar84;
  auVar184._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar42;
  auVar183._10_2_ = uVar84;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar84;
  auVar182._0_8_ = uVar42;
  uVar84 = (undefined2)uVar10;
  auVar18._4_8_ = auVar182._8_8_;
  auVar18._2_2_ = uVar84;
  auVar18._0_2_ = uVar84;
  fVar211 = (float)((int)sVar49 >> 8);
  fVar212 = (float)(auVar18._0_4_ >> 0x18);
  fVar213 = (float)(auVar182._8_4_ >> 0x18);
  uVar40 = (ulong)(uint)((int)(uVar36 * 5) << 2);
  uVar32 = *(undefined4 *)(prim + uVar40 + 6);
  uVar83 = (undefined1)((uint)uVar32 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar32 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar32));
  uVar83 = (undefined1)((uint)uVar32 >> 8);
  uVar10 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar83),uVar83);
  sVar49 = CONCAT11((char)uVar32,(char)uVar32);
  uVar42 = CONCAT62(uVar10,sVar49);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar42;
  auVar187._12_2_ = uVar84;
  auVar187._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar42;
  auVar186._10_2_ = uVar84;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar84;
  auVar185._0_8_ = uVar42;
  uVar84 = (undefined2)uVar10;
  auVar19._4_8_ = auVar185._8_8_;
  auVar19._2_2_ = uVar84;
  auVar19._0_2_ = uVar84;
  fVar234 = (float)((int)sVar49 >> 8);
  fVar239 = (float)(auVar19._0_4_ >> 0x18);
  fVar240 = (float)(auVar185._8_4_ >> 0x18);
  fVar224 = fVar87 * fVar110 + fVar108 * fVar141 + fVar109 * fVar151;
  fVar231 = fVar87 * fVar119 + fVar108 * fVar149 + fVar109 * fVar160;
  fVar232 = fVar87 * fVar121 + fVar108 * fVar150 + fVar109 * fVar161;
  fVar233 = fVar87 * (float)(auVar208._12_4_ >> 0x18) +
            fVar108 * (float)(auVar53._12_4_ >> 0x18) + fVar109 * (float)(auVar56._12_4_ >> 0x18);
  fVar214 = fVar87 * fVar50 + fVar108 * fVar162 + fVar109 * fVar206;
  fVar218 = fVar87 * fVar85 + fVar108 * fVar170 + fVar109 * fVar209;
  fVar220 = fVar87 * fVar86 + fVar108 * fVar171 + fVar109 * fVar210;
  fVar222 = fVar87 * (float)(auVar59._12_4_ >> 0x18) +
            fVar108 * (float)(auVar164._12_4_ >> 0x18) + fVar109 * (float)(auVar177._12_4_ >> 0x18);
  fVar174 = fVar87 * fVar198 + fVar108 * fVar211 + fVar109 * fVar234;
  fVar193 = fVar87 * fVar204 + fVar108 * fVar212 + fVar109 * fVar239;
  fVar195 = fVar87 * fVar205 + fVar108 * fVar213 + fVar109 * fVar240;
  fVar87 = fVar87 * (float)(auVar180._12_4_ >> 0x18) +
           fVar108 * (float)(auVar183._12_4_ >> 0x18) + fVar109 * (float)(auVar186._12_4_ >> 0x18);
  fVar111 = fVar110 * fVar125 + fVar141 * fVar139 + fVar151 * fVar140;
  fVar160 = fVar119 * fVar125 + fVar149 * fVar139 + fVar160 * fVar140;
  fVar161 = fVar121 * fVar125 + fVar150 * fVar139 + fVar161 * fVar140;
  fVar123 = (float)(auVar208._12_4_ >> 0x18) * fVar125 +
            (float)(auVar53._12_4_ >> 0x18) * fVar139 + (float)(auVar56._12_4_ >> 0x18) * fVar140;
  fVar162 = fVar50 * fVar125 + fVar162 * fVar139 + fVar206 * fVar140;
  fVar170 = fVar85 * fVar125 + fVar170 * fVar139 + fVar209 * fVar140;
  fVar171 = fVar86 * fVar125 + fVar171 * fVar139 + fVar210 * fVar140;
  fVar206 = (float)(auVar59._12_4_ >> 0x18) * fVar125 +
            (float)(auVar164._12_4_ >> 0x18) * fVar139 + (float)(auVar177._12_4_ >> 0x18) * fVar140;
  fVar141 = fVar125 * fVar198 + fVar139 * fVar211 + fVar140 * fVar234;
  fVar149 = fVar125 * fVar204 + fVar139 * fVar212 + fVar140 * fVar239;
  fVar150 = fVar125 * fVar205 + fVar139 * fVar213 + fVar140 * fVar240;
  fVar151 = fVar125 * (float)(auVar180._12_4_ >> 0x18) +
            fVar139 * (float)(auVar183._12_4_ >> 0x18) + fVar140 * (float)(auVar186._12_4_ >> 0x18);
  fVar109 = (float)DAT_01f80d30;
  fVar50 = DAT_01f80d30._4_4_;
  fVar85 = DAT_01f80d30._8_4_;
  fVar86 = DAT_01f80d30._12_4_;
  uVar43 = -(uint)(fVar109 <= ABS(fVar224));
  uVar44 = -(uint)(fVar50 <= ABS(fVar231));
  uVar45 = -(uint)(fVar85 <= ABS(fVar232));
  uVar47 = -(uint)(fVar86 <= ABS(fVar233));
  auVar229._0_4_ = (uint)fVar224 & uVar43;
  auVar229._4_4_ = (uint)fVar231 & uVar44;
  auVar229._8_4_ = (uint)fVar232 & uVar45;
  auVar229._12_4_ = (uint)fVar233 & uVar47;
  auVar126._0_4_ = ~uVar43 & (uint)fVar109;
  auVar126._4_4_ = ~uVar44 & (uint)fVar50;
  auVar126._8_4_ = ~uVar45 & (uint)fVar85;
  auVar126._12_4_ = ~uVar47 & (uint)fVar86;
  auVar126 = auVar126 | auVar229;
  uVar43 = -(uint)(fVar109 <= ABS(fVar214));
  uVar44 = -(uint)(fVar50 <= ABS(fVar218));
  uVar45 = -(uint)(fVar85 <= ABS(fVar220));
  uVar47 = -(uint)(fVar86 <= ABS(fVar222));
  auVar133._0_4_ = (uint)fVar214 & uVar43;
  auVar133._4_4_ = (uint)fVar218 & uVar44;
  auVar133._8_4_ = (uint)fVar220 & uVar45;
  auVar133._12_4_ = (uint)fVar222 & uVar47;
  auVar142._0_4_ = ~uVar43 & (uint)fVar109;
  auVar142._4_4_ = ~uVar44 & (uint)fVar50;
  auVar142._8_4_ = ~uVar45 & (uint)fVar85;
  auVar142._12_4_ = ~uVar47 & (uint)fVar86;
  auVar142 = auVar142 | auVar133;
  uVar43 = -(uint)(fVar109 <= ABS(fVar174));
  uVar44 = -(uint)(fVar50 <= ABS(fVar193));
  uVar45 = -(uint)(fVar85 <= ABS(fVar195));
  uVar47 = -(uint)(fVar86 <= ABS(fVar87));
  auVar188._0_4_ = (uint)fVar174 & uVar43;
  auVar188._4_4_ = (uint)fVar193 & uVar44;
  auVar188._8_4_ = (uint)fVar195 & uVar45;
  auVar188._12_4_ = (uint)fVar87 & uVar47;
  auVar166._0_4_ = ~uVar43 & (uint)fVar109;
  auVar166._4_4_ = ~uVar44 & (uint)fVar50;
  auVar166._8_4_ = ~uVar45 & (uint)fVar85;
  auVar166._12_4_ = ~uVar47 & (uint)fVar86;
  auVar166 = auVar166 | auVar188;
  auVar61 = rcpps(_DAT_01f80d30,auVar126);
  fVar109 = auVar61._0_4_;
  fVar86 = auVar61._4_4_;
  fVar110 = auVar61._8_4_;
  fVar125 = auVar61._12_4_;
  fVar109 = (1.0 - auVar126._0_4_ * fVar109) * fVar109 + fVar109;
  fVar86 = (1.0 - auVar126._4_4_ * fVar86) * fVar86 + fVar86;
  fVar110 = (1.0 - auVar126._8_4_ * fVar110) * fVar110 + fVar110;
  fVar125 = (1.0 - auVar126._12_4_ * fVar125) * fVar125 + fVar125;
  auVar61 = rcpps(auVar61,auVar142);
  fVar50 = auVar61._0_4_;
  fVar87 = auVar61._4_4_;
  fVar119 = auVar61._8_4_;
  fVar139 = auVar61._12_4_;
  fVar50 = (1.0 - auVar142._0_4_ * fVar50) * fVar50 + fVar50;
  fVar87 = (1.0 - auVar142._4_4_ * fVar87) * fVar87 + fVar87;
  fVar119 = (1.0 - auVar142._8_4_ * fVar119) * fVar119 + fVar119;
  fVar139 = (1.0 - auVar142._12_4_ * fVar139) * fVar139 + fVar139;
  auVar61 = rcpps(auVar61,auVar166);
  fVar85 = auVar61._0_4_;
  fVar108 = auVar61._4_4_;
  fVar121 = auVar61._8_4_;
  fVar140 = auVar61._12_4_;
  fVar85 = (1.0 - auVar166._0_4_ * fVar85) * fVar85 + fVar85;
  fVar108 = (1.0 - auVar166._4_4_ * fVar108) * fVar108 + fVar108;
  fVar121 = (1.0 - auVar166._8_4_ * fVar121) * fVar121 + fVar121;
  fVar140 = (1.0 - auVar166._12_4_ * fVar140) * fVar140 + fVar140;
  uVar42 = *(ulong *)(prim + uVar36 * 7 + 6);
  uVar84 = (undefined2)(uVar42 >> 0x30);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar42;
  auVar64._12_2_ = uVar84;
  auVar64._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar42 >> 0x20);
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar42;
  auVar63._10_2_ = uVar84;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._8_2_ = uVar84;
  auVar62._0_8_ = uVar42;
  uVar84 = (undefined2)(uVar42 >> 0x10);
  auVar20._4_8_ = auVar62._8_8_;
  auVar20._2_2_ = uVar84;
  auVar20._0_2_ = uVar84;
  auVar127._0_8_ =
       CONCAT44(((float)(auVar20._0_4_ >> 0x10) - fVar160) * fVar86,
                ((float)(int)(short)uVar42 - fVar111) * fVar109);
  auVar127._8_4_ = ((float)(auVar62._8_4_ >> 0x10) - fVar161) * fVar110;
  auVar127._12_4_ = ((float)(auVar63._12_4_ >> 0x10) - fVar123) * fVar125;
  uVar42 = *(ulong *)(prim + uVar36 * 9 + 6);
  uVar84 = (undefined2)(uVar42 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar42;
  auVar67._12_2_ = uVar84;
  auVar67._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar42 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar42;
  auVar66._10_2_ = uVar84;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar84;
  auVar65._0_8_ = uVar42;
  uVar84 = (undefined2)(uVar42 >> 0x10);
  auVar21._4_8_ = auVar65._8_8_;
  auVar21._2_2_ = uVar84;
  auVar21._0_2_ = uVar84;
  auVar167._0_4_ = ((float)(int)(short)uVar42 - fVar111) * fVar109;
  auVar167._4_4_ = ((float)(auVar21._0_4_ >> 0x10) - fVar160) * fVar86;
  auVar167._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar161) * fVar110;
  auVar167._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar123) * fVar125;
  lVar33 = uVar40 + uVar36;
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar40 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar36 * -2 + 6);
  uVar84 = (undefined2)(uVar40 >> 0x30);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar40;
  auVar191._12_2_ = uVar84;
  auVar191._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar40 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar40;
  auVar190._10_2_ = uVar84;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar84;
  auVar189._0_8_ = uVar40;
  uVar84 = (undefined2)(uVar40 >> 0x10);
  auVar22._4_8_ = auVar189._8_8_;
  auVar22._2_2_ = uVar84;
  auVar22._0_2_ = uVar84;
  auVar192._0_8_ =
       CONCAT44(((float)(auVar22._0_4_ >> 0x10) - fVar170) * fVar87,
                ((float)(int)(short)uVar40 - fVar162) * fVar50);
  auVar192._8_4_ = ((float)(auVar189._8_4_ >> 0x10) - fVar171) * fVar119;
  auVar192._12_4_ = ((float)(auVar190._12_4_ >> 0x10) - fVar206) * fVar139;
  uVar84 = (undefined2)(uVar42 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar42;
  auVar70._12_2_ = uVar84;
  auVar70._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar42 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar42;
  auVar69._10_2_ = uVar84;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar84;
  auVar68._0_8_ = uVar42;
  uVar84 = (undefined2)(uVar42 >> 0x10);
  auVar23._4_8_ = auVar68._8_8_;
  auVar23._2_2_ = uVar84;
  auVar23._0_2_ = uVar84;
  auVar71._0_4_ = ((float)(int)(short)uVar42 - fVar162) * fVar50;
  auVar71._4_4_ = ((float)(auVar23._0_4_ >> 0x10) - fVar170) * fVar87;
  auVar71._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar171) * fVar119;
  auVar71._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar206) * fVar139;
  uVar42 = *(ulong *)(prim + lVar33 + 6);
  uVar84 = (undefined2)(uVar42 >> 0x30);
  auVar154._8_4_ = 0;
  auVar154._0_8_ = uVar42;
  auVar154._12_2_ = uVar84;
  auVar154._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar42 >> 0x20);
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._8_2_ = 0;
  auVar153._0_8_ = uVar42;
  auVar153._10_2_ = uVar84;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._8_2_ = uVar84;
  auVar152._0_8_ = uVar42;
  uVar84 = (undefined2)(uVar42 >> 0x10);
  auVar24._4_8_ = auVar152._8_8_;
  auVar24._2_2_ = uVar84;
  auVar24._0_2_ = uVar84;
  auVar155._0_8_ =
       CONCAT44(((float)(auVar24._0_4_ >> 0x10) - fVar149) * fVar108,
                ((float)(int)(short)uVar42 - fVar141) * fVar85);
  auVar155._8_4_ = ((float)(auVar152._8_4_ >> 0x10) - fVar150) * fVar121;
  auVar155._12_4_ = ((float)(auVar153._12_4_ >> 0x10) - fVar151) * fVar140;
  uVar42 = *(ulong *)(prim + uVar36 * 0x17 + 6);
  uVar84 = (undefined2)(uVar42 >> 0x30);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar42;
  auVar201._12_2_ = uVar84;
  auVar201._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar42 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar42;
  auVar200._10_2_ = uVar84;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar84;
  auVar199._0_8_ = uVar42;
  uVar84 = (undefined2)(uVar42 >> 0x10);
  auVar25._4_8_ = auVar199._8_8_;
  auVar25._2_2_ = uVar84;
  auVar25._0_2_ = uVar84;
  auVar202._0_4_ = ((float)(int)(short)uVar42 - fVar141) * fVar85;
  auVar202._4_4_ = ((float)(auVar25._0_4_ >> 0x10) - fVar149) * fVar108;
  auVar202._8_4_ = ((float)(auVar199._8_4_ >> 0x10) - fVar150) * fVar121;
  auVar202._12_4_ = ((float)(auVar200._12_4_ >> 0x10) - fVar151) * fVar140;
  auVar207._8_4_ = auVar127._8_4_;
  auVar207._0_8_ = auVar127._0_8_;
  auVar207._12_4_ = auVar127._12_4_;
  auVar208 = minps(auVar207,auVar167);
  auVar88._8_4_ = auVar192._8_4_;
  auVar88._0_8_ = auVar192._0_8_;
  auVar88._12_4_ = auVar192._12_4_;
  auVar61 = minps(auVar88,auVar71);
  auVar208 = maxps(auVar208,auVar61);
  auVar89._8_4_ = auVar155._8_4_;
  auVar89._0_8_ = auVar155._0_8_;
  auVar89._12_4_ = auVar155._12_4_;
  auVar61 = minps(auVar89,auVar202);
  uVar32 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar143._4_4_ = uVar32;
  auVar143._0_4_ = uVar32;
  auVar143._8_4_ = uVar32;
  auVar143._12_4_ = uVar32;
  auVar61 = maxps(auVar61,auVar143);
  auVar61 = maxps(auVar208,auVar61);
  local_48 = auVar61._0_4_ * 0.99999964;
  fStack_44 = auVar61._4_4_ * 0.99999964;
  fStack_40 = auVar61._8_4_ * 0.99999964;
  fStack_3c = auVar61._12_4_ * 0.99999964;
  auVar61 = maxps(auVar127,auVar167);
  auVar208 = maxps(auVar192,auVar71);
  auVar61 = minps(auVar61,auVar208);
  auVar208 = maxps(auVar155,auVar202);
  fVar109 = (ray->super_RayK<1>).tfar;
  auVar72._4_4_ = fVar109;
  auVar72._0_4_ = fVar109;
  auVar72._8_4_ = fVar109;
  auVar72._12_4_ = fVar109;
  auVar208 = minps(auVar208,auVar72);
  auVar61 = minps(auVar61,auVar208);
  auVar90._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_48 <= auVar61._0_4_ * 1.0000004);
  auVar90._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_44 <= auVar61._4_4_ * 1.0000004);
  auVar90._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_40 <= auVar61._8_4_ * 1.0000004);
  auVar90._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_3c <= auVar61._12_4_ * 1.0000004);
  uVar43 = movmskps((int)lVar33,auVar90);
  if (uVar43 != 0) {
    uVar43 = uVar43 & 0xff;
    local_338 = mm_lookupmask_ps._0_8_;
    uStack_330 = mm_lookupmask_ps._8_8_;
    local_3e8 = context;
    local_378 = pre;
    local_370 = prim;
    do {
      uVar42 = (ulong)uVar43;
      local_46c._4_16_ = auVar133;
      local_458 = auVar229;
      lVar33 = 0;
      if (uVar42 != 0) {
        for (; (uVar43 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
        }
      }
      uVar42 = uVar42 - 1 & uVar42;
      uVar43 = *(uint *)(prim + 2);
      uVar44 = *(uint *)(prim + lVar33 * 4 + 6);
      local_420 = (ulong)uVar43;
      pGVar39 = (context->scene->geometries).items[uVar43].ptr;
      _Var7 = pGVar39[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_3e0 = (ulong)uVar44;
      uVar40 = (ulong)*(uint *)(*(long *)&pGVar39->field_0x58 + _Var7 * uVar44);
      p_Var37 = pGVar39[1].intersectionFilterN;
      lVar33 = *(long *)&pGVar39[1].time_range.upper;
      pfVar1 = (float *)(lVar33 + (long)p_Var37 * uVar40);
      local_398 = *pfVar1;
      fStack_394 = pfVar1[1];
      fStack_390 = pfVar1[2];
      fStack_38c = pfVar1[3];
      pfVar2 = (float *)(lVar33 + (uVar40 + 1) * (long)p_Var37);
      fVar109 = *pfVar2;
      fVar50 = pfVar2[1];
      fVar85 = pfVar2[2];
      fStack_3fc = pfVar2[3];
      pfVar2 = (float *)(lVar33 + (uVar40 + 2) * (long)p_Var37);
      fVar86 = *pfVar2;
      fVar87 = pfVar2[1];
      fVar108 = pfVar2[2];
      fStack_40c = pfVar2[3];
      lVar38 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
        }
      }
      pfVar2 = (float *)(lVar33 + (uVar40 + 3) * (long)p_Var37);
      local_328 = *pfVar2;
      fStack_324 = pfVar2[1];
      fStack_320 = pfVar2[2];
      fStack_31c = pfVar2[3];
      if ((uVar42 != 0) && (uVar40 = uVar42 - 1 & uVar42, uVar40 != 0)) {
        lVar33 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> lVar33 & 1) == 0; lVar33 = lVar33 + 1) {
          }
        }
        p_Var37 = (RTCFilterFunctionN)
                  ((long)p_Var37 *
                  (ulong)*(uint *)(*(long *)&pGVar39->field_0x58 +
                                  _Var7 * *(uint *)(prim + lVar33 * 4 + 6)));
      }
      iVar6 = (int)pGVar39[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_208 = (ray->super_RayK<1>).org.field_0.m128[0];
      fStack_204 = (ray->super_RayK<1>).org.field_0.m128[1];
      fStack_200 = (ray->super_RayK<1>).org.field_0.m128[2];
      fStack_1fc = (ray->super_RayK<1>).org.field_0.m128[3];
      fVar151 = local_398 - local_208;
      fVar111 = fStack_394 - fStack_204;
      fVar160 = fStack_390 - fStack_200;
      fVar110 = (pre->ray_space).vx.field_0.m128[0];
      fVar119 = (pre->ray_space).vx.field_0.m128[1];
      fVar121 = (pre->ray_space).vx.field_0.m128[2];
      fVar125 = (pre->ray_space).vy.field_0.m128[0];
      fVar139 = (pre->ray_space).vy.field_0.m128[1];
      fVar140 = (pre->ray_space).vy.field_0.m128[2];
      fVar141 = (pre->ray_space).vz.field_0.m128[0];
      fVar149 = (pre->ray_space).vz.field_0.m128[1];
      fVar150 = (pre->ray_space).vz.field_0.m128[2];
      local_98 = fVar151 * fVar110 + fVar111 * fVar125 + fVar160 * fVar141;
      local_1a8 = fVar151 * fVar119 + fVar111 * fVar139 + fVar160 * fVar149;
      local_3f8 = fVar151 * fVar121 + fVar111 * fVar140 + fVar160 * fVar150;
      fVar151 = fVar109 - local_208;
      fVar111 = fVar50 - fStack_204;
      fVar160 = fVar85 - fStack_200;
      local_2a8 = fVar151 * fVar110 + fVar111 * fVar125 + fVar160 * fVar141;
      aStack_43c.field_0.y = fVar151 * fVar119 + fVar111 * fVar139 + fVar160 * fVar149;
      local_2f8 = fVar151 * fVar121 + fVar111 * fVar140 + fVar160 * fVar150;
      fVar151 = fVar86 - local_208;
      fVar111 = fVar87 - fStack_204;
      fVar160 = fVar108 - fStack_200;
      local_258 = fVar151 * fVar110 + fVar111 * fVar125 + fVar160 * fVar141;
      local_268 = fVar151 * fVar119 + fVar111 * fVar139 + fVar160 * fVar149;
      local_288 = fVar151 * fVar121 + fVar111 * fVar140 + fVar160 * fVar150;
      fVar151 = local_328 - local_208;
      fVar111 = fStack_324 - fStack_204;
      fVar160 = fStack_320 - fStack_200;
      local_3d8 = fVar151 * fVar110 + fVar111 * fVar125 + fVar160 * fVar141;
      local_278 = fVar151 * fVar119 + fVar111 * fVar139 + fVar160 * fVar149;
      local_298 = fVar151 * fVar121 + fVar111 * fVar140 + fVar160 * fVar150;
      auVar225._0_8_ = CONCAT44(local_1a8,local_98) & 0x7fffffff7fffffff;
      auVar225._8_4_ = ABS(local_3f8);
      auVar225._12_4_ = ABS(fStack_38c);
      auVar128._0_8_ = CONCAT44(aStack_43c.field_0.y,local_2a8) & 0x7fffffff7fffffff;
      auVar128._8_4_ = ABS(local_2f8);
      auVar128._12_4_ = ABS(fStack_3fc);
      auVar208 = maxps(auVar225,auVar128);
      auVar144._0_8_ = CONCAT44(local_268,local_258) & 0x7fffffff7fffffff;
      auVar144._8_4_ = ABS(local_288);
      auVar144._12_4_ = ABS(fStack_40c);
      auVar91._0_8_ = CONCAT44(local_278,local_3d8) & 0x7fffffff7fffffff;
      auVar91._8_4_ = ABS(local_298);
      auVar91._12_4_ = ABS(fStack_31c);
      auVar61 = maxps(auVar144,auVar91);
      auVar61 = maxps(auVar208,auVar61);
      fVar110 = auVar61._4_4_;
      if (auVar61._4_4_ <= auVar61._0_4_) {
        fVar110 = auVar61._0_4_;
      }
      fVar119 = (float)iVar6;
      auVar226._8_8_ = auVar61._8_8_;
      auVar226._0_8_ = auVar61._8_8_;
      if (auVar61._8_4_ <= fVar110) {
        auVar226._0_4_ = fVar110;
      }
      _local_218 = ZEXT416((uint)fVar119);
      lVar33 = (long)iVar6 * 0x44;
      fVar110 = *(float *)(catmullrom_basis0 + lVar33 + 0x908);
      fVar121 = *(float *)(catmullrom_basis0 + lVar33 + 0x90c);
      fVar125 = *(float *)(catmullrom_basis0 + lVar33 + 0x910);
      fVar139 = *(float *)(catmullrom_basis0 + lVar33 + 0x914);
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      fStack_264 = local_268;
      fStack_260 = local_268;
      fStack_25c = local_268;
      fVar140 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar33 + 0xd8c);
      fVar141 = *(float *)(catmullrom_basis0 + lVar33 + 0xd90);
      fVar149 = *(float *)(catmullrom_basis0 + lVar33 + 0xd94);
      auVar11 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar33 + 0xd8c);
      fVar150 = *(float *)(catmullrom_basis0 + lVar33 + 0xd98);
      fStack_3d4 = local_3d8;
      fStack_3d0 = local_3d8;
      fStack_3cc = local_3d8;
      fStack_274 = local_278;
      fStack_270 = local_278;
      fStack_26c = local_278;
      local_418 = fVar86;
      fStack_414 = fVar87;
      fStack_410 = fVar108;
      fVar151 = *(float *)(catmullrom_basis0 + lVar33 + 0x484);
      fVar111 = *(float *)(catmullrom_basis0 + lVar33 + 0x488);
      fVar160 = *(float *)(catmullrom_basis0 + lVar33 + 0x48c);
      fVar161 = *(float *)(catmullrom_basis0 + lVar33 + 0x490);
      local_408 = fVar109;
      fStack_404 = fVar50;
      fStack_400 = fVar85;
      fVar123 = *(float *)(catmullrom_basis0 + lVar33);
      fVar162 = *(float *)(catmullrom_basis0 + lVar33 + 4);
      fVar170 = *(float *)(catmullrom_basis0 + lVar33 + 8);
      fVar171 = *(float *)(catmullrom_basis0 + lVar33 + 0xc);
      local_2c8 = local_98 * fVar123 +
                  local_2a8 * fVar151 + local_258 * fVar110 + local_3d8 * fVar140;
      fStack_2c4 = local_98 * fVar162 +
                   local_2a8 * fVar111 + local_258 * fVar121 + local_3d8 * fVar141;
      fStack_2c0 = local_98 * fVar170 +
                   local_2a8 * fVar160 + local_258 * fVar125 + local_3d8 * fVar149;
      fStack_2bc = local_98 * fVar171 +
                   local_2a8 * fVar161 + local_258 * fVar139 + local_3d8 * fVar150;
      local_1c8 = local_1a8 * fVar123 +
                  aStack_43c.field_0.y * fVar151 + local_268 * fVar110 + local_278 * fVar140;
      fStack_1c4 = local_1a8 * fVar162 +
                   aStack_43c.field_0.y * fVar111 + local_268 * fVar121 + local_278 * fVar141;
      fStack_1c0 = local_1a8 * fVar170 +
                   aStack_43c.field_0.y * fVar160 + local_268 * fVar125 + local_278 * fVar149;
      fStack_1bc = local_1a8 * fVar171 +
                   aStack_43c.field_0.y * fVar161 + local_268 * fVar139 + local_278 * fVar150;
      local_2b8._0_4_ =
           fStack_38c * fVar123 + fStack_3fc * fVar151 + fStack_40c * fVar110 + fStack_31c * fVar140
      ;
      local_2b8._4_4_ =
           fStack_38c * fVar162 + fStack_3fc * fVar111 + fStack_40c * fVar121 + fStack_31c * fVar141
      ;
      local_2b8._8_4_ =
           fStack_38c * fVar170 + fStack_3fc * fVar160 + fStack_40c * fVar125 + fStack_31c * fVar149
      ;
      local_2b8._12_4_ =
           fStack_38c * fVar171 + fStack_3fc * fVar161 + fStack_40c * fVar139 + fStack_31c * fVar150
      ;
      fVar140 = *(float *)(catmullrom_basis1 + lVar33 + 0xd8c);
      fVar141 = *(float *)(catmullrom_basis1 + lVar33 + 0xd90);
      fVar149 = *(float *)(catmullrom_basis1 + lVar33 + 0xd94);
      fVar174 = *(float *)(catmullrom_basis1 + lVar33 + 0xd98);
      fVar193 = *(float *)(catmullrom_basis1 + lVar33 + 0x908);
      fVar195 = *(float *)(catmullrom_basis1 + lVar33 + 0x90c);
      fVar198 = *(float *)(catmullrom_basis1 + lVar33 + 0x910);
      fVar204 = *(float *)(catmullrom_basis1 + lVar33 + 0x914);
      local_b8 = fStack_31c;
      fStack_b4 = fStack_31c;
      fStack_b0 = fStack_31c;
      fStack_ac = fStack_31c;
      local_a8 = fStack_40c;
      fStack_a4 = fStack_40c;
      fStack_a0 = fStack_40c;
      fStack_9c = fStack_40c;
      fVar205 = *(float *)(catmullrom_basis1 + lVar33 + 0x484);
      fVar206 = *(float *)(catmullrom_basis1 + lVar33 + 0x488);
      fVar209 = *(float *)(catmullrom_basis1 + lVar33 + 0x48c);
      fVar210 = *(float *)(catmullrom_basis1 + lVar33 + 0x490);
      fStack_2a4 = local_2a8;
      fStack_2a0 = local_2a8;
      fStack_29c = local_2a8;
      aStack_43c.field_0.z = aStack_43c.field_0.y;
      fStack_430 = aStack_43c.field_0.y;
      fStack_42c = aStack_43c.field_0.y;
      local_c8 = fStack_3fc;
      fStack_c4 = fStack_3fc;
      fStack_c0 = fStack_3fc;
      fStack_bc = fStack_3fc;
      fVar211 = *(float *)(catmullrom_basis1 + lVar33);
      fVar212 = *(float *)(catmullrom_basis1 + lVar33 + 4);
      fVar213 = *(float *)(catmullrom_basis1 + lVar33 + 8);
      fVar214 = *(float *)(catmullrom_basis1 + lVar33 + 0xc);
      fStack_94 = local_98;
      fStack_90 = local_98;
      fStack_8c = local_98;
      local_1b8 = local_98 * fVar211 +
                  local_2a8 * fVar205 + local_258 * fVar193 + local_3d8 * fVar140;
      fStack_1b4 = local_98 * fVar212 +
                   local_2a8 * fVar206 + local_258 * fVar195 + local_3d8 * fVar141;
      fStack_1b0 = local_98 * fVar213 +
                   local_2a8 * fVar209 + local_258 * fVar198 + local_3d8 * fVar149;
      fStack_1ac = local_98 * fVar214 +
                   local_2a8 * fVar210 + local_258 * fVar204 + local_3d8 * fVar174;
      fStack_1a4 = local_1a8;
      fStack_1a0 = local_1a8;
      fStack_19c = local_1a8;
      fVar218 = local_1a8 * fVar211 +
                aStack_43c.field_0.y * fVar205 + local_268 * fVar193 + local_278 * fVar140;
      fVar220 = local_1a8 * fVar212 +
                aStack_43c.field_0.y * fVar206 + local_268 * fVar195 + local_278 * fVar141;
      fVar222 = local_1a8 * fVar213 +
                aStack_43c.field_0.y * fVar209 + local_268 * fVar198 + local_278 * fVar149;
      fVar224 = local_1a8 * fVar214 +
                aStack_43c.field_0.y * fVar210 + local_268 * fVar204 + local_278 * fVar174;
      local_d8 = fStack_38c;
      fStack_d4 = fStack_38c;
      fStack_d0 = fStack_38c;
      fStack_cc = fStack_38c;
      local_318._0_4_ =
           fStack_38c * fVar211 + fStack_3fc * fVar205 + fStack_40c * fVar193 + fStack_31c * fVar140
      ;
      local_318._4_4_ =
           fStack_38c * fVar212 + fStack_3fc * fVar206 + fStack_40c * fVar195 + fStack_31c * fVar141
      ;
      fStack_310 = fStack_38c * fVar213 +
                   fStack_3fc * fVar209 + fStack_40c * fVar198 + fStack_31c * fVar149;
      fStack_30c = fStack_38c * fVar214 +
                   fStack_3fc * fVar210 + fStack_40c * fVar204 + fStack_31c * fVar174;
      fVar239 = local_1b8 - local_2c8;
      fVar240 = fStack_1b4 - fStack_2c4;
      fVar172 = fStack_1b0 - fStack_2c0;
      fVar173 = fStack_1ac - fStack_2bc;
      fVar231 = fVar218 - local_1c8;
      fVar232 = fVar220 - fStack_1c4;
      fVar233 = fVar222 - fStack_1c0;
      fVar234 = fVar224 - fStack_1bc;
      fVar243 = local_1c8 * fVar239 - local_2c8 * fVar231;
      fVar245 = fStack_1c4 * fVar240 - fStack_2c4 * fVar232;
      fVar247 = fStack_1c0 * fVar172 - fStack_2c0 * fVar233;
      fVar249 = fStack_1bc * fVar173 - fStack_2bc * fVar234;
      auVar61 = maxps(local_2b8,_local_318);
      bVar28 = fVar243 * fVar243 <=
               auVar61._0_4_ * auVar61._0_4_ * (fVar239 * fVar239 + fVar231 * fVar231) &&
               0.0 < fVar119;
      local_2d8 = (float)-(uint)bVar28;
      bVar29 = fVar245 * fVar245 <=
               auVar61._4_4_ * auVar61._4_4_ * (fVar240 * fVar240 + fVar232 * fVar232) &&
               1.0 < fVar119;
      fStack_2d4 = (float)-(uint)bVar29;
      bVar27 = fVar247 * fVar247 <=
               auVar61._8_4_ * auVar61._8_4_ * (fVar172 * fVar172 + fVar233 * fVar233) &&
               2.0 < fVar119;
      fStack_2d0 = (float)-(uint)bVar27;
      bVar26 = fVar249 * fVar249 <=
               auVar61._12_4_ * auVar61._12_4_ * (fVar173 * fVar173 + fVar234 * fVar234) &&
               3.0 < fVar119;
      fStack_2cc = (float)-(uint)bVar26;
      local_308 = auVar226._0_4_;
      fStack_304 = auVar226._4_4_;
      fStack_300 = auVar226._8_4_;
      fStack_2fc = auVar226._12_4_;
      local_308 = local_308 * 4.7683716e-07;
      auVar8._4_4_ = fStack_2d4;
      auVar8._0_4_ = local_2d8;
      auVar8._8_4_ = fStack_2d0;
      auVar8._12_4_ = fStack_2cc;
      iVar30 = movmskps(iVar6,auVar8);
      fStack_3f4 = local_3f8;
      fStack_3f0 = local_3f8;
      fStack_3ec = local_3f8;
      fStack_2f4 = local_2f8;
      fStack_2f0 = local_2f8;
      fStack_2ec = local_2f8;
      fStack_284 = local_288;
      fStack_280 = local_288;
      fStack_27c = local_288;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      if (iVar30 == 0) {
        uVar45 = 0;
      }
      else {
        local_448._0_4_ =
             fVar140 * local_298 + fVar193 * local_288 + fVar205 * local_2f8 + fVar211 * local_3f8;
        local_448._4_4_ =
             fVar141 * local_298 + fVar195 * local_288 + fVar206 * local_2f8 + fVar212 * local_3f8;
        fStack_440 = fVar149 * local_298 + fVar198 * local_288 + fVar209 * local_2f8 +
                     fVar213 * local_3f8;
        aStack_43c.field_0.x =
             fVar174 * local_298 + fVar204 * local_288 + fVar210 * local_2f8 + fVar214 * local_3f8;
        local_488._0_4_ = auVar11._0_4_;
        local_488._4_4_ = auVar11._4_4_;
        fStack_480 = auVar11._8_4_;
        fVar249 = (float)local_488._0_4_ * local_298 + fVar110 * local_288 + fVar151 * local_2f8 +
                  fVar123 * local_3f8;
        fVar120 = (float)local_488._4_4_ * local_298 + fVar121 * local_288 + fVar111 * local_2f8 +
                  fVar162 * local_3f8;
        fVar122 = fStack_480 * local_298 + fVar125 * local_288 + fVar160 * local_2f8 +
                  fVar170 * local_3f8;
        fVar124 = fVar150 * local_298 + fVar139 * local_288 + fVar161 * local_2f8 +
                  fVar171 * local_3f8;
        fVar110 = *(float *)(catmullrom_basis0 + lVar33 + 0x1210);
        fVar121 = *(float *)(catmullrom_basis0 + lVar33 + 0x1214);
        fVar125 = *(float *)(catmullrom_basis0 + lVar33 + 0x1218);
        fVar139 = *(float *)(catmullrom_basis0 + lVar33 + 0x121c);
        fVar140 = *(float *)(catmullrom_basis0 + lVar33 + 0x1694);
        fVar141 = *(float *)(catmullrom_basis0 + lVar33 + 0x1698);
        fVar149 = *(float *)(catmullrom_basis0 + lVar33 + 0x169c);
        fVar150 = *(float *)(catmullrom_basis0 + lVar33 + 0x16a0);
        fVar151 = *(float *)(catmullrom_basis0 + lVar33 + 0x1b18);
        fVar111 = *(float *)(catmullrom_basis0 + lVar33 + 0x1b1c);
        fVar160 = *(float *)(catmullrom_basis0 + lVar33 + 0x1b20);
        fVar161 = *(float *)(catmullrom_basis0 + lVar33 + 0x1b24);
        fVar123 = *(float *)(catmullrom_basis0 + lVar33 + 0x1f9c);
        fVar162 = *(float *)(catmullrom_basis0 + lVar33 + 0x1fa0);
        fVar170 = *(float *)(catmullrom_basis0 + lVar33 + 0x1fa4);
        fVar171 = *(float *)(catmullrom_basis0 + lVar33 + 0x1fa8);
        fVar215 = local_98 * fVar110 +
                  local_2a8 * fVar140 + local_258 * fVar151 + local_3d8 * fVar123;
        fVar219 = local_98 * fVar121 +
                  local_2a8 * fVar141 + local_258 * fVar111 + local_3d8 * fVar162;
        fVar221 = local_98 * fVar125 +
                  local_2a8 * fVar149 + local_258 * fVar160 + local_3d8 * fVar170;
        fVar223 = local_98 * fVar139 +
                  local_2a8 * fVar150 + local_258 * fVar161 + local_3d8 * fVar171;
        fVar244 = local_1a8 * fVar110 +
                  aStack_43c.field_0.y * fVar140 + local_268 * fVar151 + local_278 * fVar123;
        fVar246 = local_1a8 * fVar121 +
                  aStack_43c.field_0.y * fVar141 + local_268 * fVar111 + local_278 * fVar162;
        fVar248 = local_1a8 * fVar125 +
                  aStack_43c.field_0.y * fVar149 + local_268 * fVar160 + local_278 * fVar170;
        fVar250 = local_1a8 * fVar139 +
                  aStack_43c.field_0.y * fVar150 + local_268 * fVar161 + local_278 * fVar171;
        fVar174 = *(float *)(catmullrom_basis1 + lVar33 + 0x1210);
        fVar193 = *(float *)(catmullrom_basis1 + lVar33 + 0x1214);
        fVar195 = *(float *)(catmullrom_basis1 + lVar33 + 0x1218);
        fVar198 = *(float *)(catmullrom_basis1 + lVar33 + 0x121c);
        fVar204 = *(float *)(catmullrom_basis1 + lVar33 + 0x1b18);
        fVar205 = *(float *)(catmullrom_basis1 + lVar33 + 0x1b1c);
        fVar206 = *(float *)(catmullrom_basis1 + lVar33 + 0x1b20);
        fVar209 = *(float *)(catmullrom_basis1 + lVar33 + 0x1b24);
        fVar210 = *(float *)(catmullrom_basis1 + lVar33 + 0x1f9c);
        fVar211 = *(float *)(catmullrom_basis1 + lVar33 + 0x1fa0);
        fVar212 = *(float *)(catmullrom_basis1 + lVar33 + 0x1fa4);
        fVar213 = *(float *)(catmullrom_basis1 + lVar33 + 0x1fa8);
        fVar214 = *(float *)(catmullrom_basis1 + lVar33 + 0x1694);
        fVar243 = *(float *)(catmullrom_basis1 + lVar33 + 0x1698);
        fVar245 = *(float *)(catmullrom_basis1 + lVar33 + 0x169c);
        fVar247 = *(float *)(catmullrom_basis1 + lVar33 + 0x16a0);
        auVar92._0_4_ = fVar204 * local_288 + fVar210 * local_298;
        auVar92._4_4_ = fVar205 * local_288 + fVar211 * local_298;
        auVar92._8_4_ = fVar206 * local_288 + fVar212 * local_298;
        auVar92._12_4_ = fVar209 * local_288 + fVar213 * local_298;
        fVar175 = local_98 * fVar174 +
                  local_2a8 * fVar214 + local_258 * fVar204 + local_3d8 * fVar210;
        fVar194 = local_98 * fVar193 +
                  local_2a8 * fVar243 + local_258 * fVar205 + local_3d8 * fVar211;
        fVar196 = local_98 * fVar195 +
                  local_2a8 * fVar245 + local_258 * fVar206 + local_3d8 * fVar212;
        fVar197 = local_98 * fVar198 +
                  local_2a8 * fVar247 + local_258 * fVar209 + local_3d8 * fVar213;
        fVar204 = local_1a8 * fVar174 +
                  aStack_43c.field_0.y * fVar214 + local_268 * fVar204 + local_278 * fVar210;
        fVar205 = local_1a8 * fVar193 +
                  aStack_43c.field_0.y * fVar243 + local_268 * fVar205 + local_278 * fVar211;
        fVar206 = local_1a8 * fVar195 +
                  aStack_43c.field_0.y * fVar245 + local_268 * fVar206 + local_278 * fVar212;
        fVar209 = local_1a8 * fVar198 +
                  aStack_43c.field_0.y * fVar247 + local_268 * fVar209 + local_278 * fVar213;
        auVar227._0_8_ = CONCAT44(fVar219,fVar215) & 0x7fffffff7fffffff;
        auVar227._8_4_ = ABS(fVar221);
        auVar227._12_4_ = ABS(fVar223);
        auVar73._0_8_ = CONCAT44(fVar246,fVar244) & 0x7fffffff7fffffff;
        auVar73._8_4_ = ABS(fVar248);
        auVar73._12_4_ = ABS(fVar250);
        auVar61 = maxps(auVar227,auVar73);
        auVar235._0_8_ =
             CONCAT44(fVar121 * local_3f8 +
                      fVar141 * local_2f8 + fVar111 * local_288 + fVar162 * local_298,
                      fVar110 * local_3f8 +
                      fVar140 * local_2f8 + fVar151 * local_288 + fVar123 * local_298) &
             0x7fffffff7fffffff;
        auVar235._8_4_ =
             ABS(fVar125 * local_3f8 +
                 fVar149 * local_2f8 + fVar160 * local_288 + fVar170 * local_298);
        auVar235._12_4_ =
             ABS(fVar139 * local_3f8 +
                 fVar150 * local_2f8 + fVar161 * local_288 + fVar171 * local_298);
        auVar61 = maxps(auVar61,auVar235);
        uVar45 = -(uint)(local_308 <= auVar61._0_4_);
        uVar47 = -(uint)(local_308 <= auVar61._4_4_);
        uVar46 = -(uint)(local_308 <= auVar61._8_4_);
        uVar48 = -(uint)(local_308 <= auVar61._12_4_);
        fVar140 = (float)((uint)fVar215 & uVar45 | ~uVar45 & (uint)fVar239);
        fVar149 = (float)((uint)fVar219 & uVar47 | ~uVar47 & (uint)fVar240);
        fVar150 = (float)((uint)fVar221 & uVar46 | ~uVar46 & (uint)fVar172);
        fVar210 = (float)((uint)fVar223 & uVar48 | ~uVar48 & (uint)fVar173);
        fVar151 = (float)(~uVar45 & (uint)fVar231 | (uint)fVar244 & uVar45);
        fVar160 = (float)(~uVar47 & (uint)fVar232 | (uint)fVar246 & uVar47);
        fVar123 = (float)(~uVar46 & (uint)fVar233 | (uint)fVar248 & uVar46);
        fVar170 = (float)(~uVar48 & (uint)fVar234 | (uint)fVar250 & uVar48);
        auVar236._0_8_ = CONCAT44(fVar194,fVar175) & 0x7fffffff7fffffff;
        auVar236._8_4_ = ABS(fVar196);
        auVar236._12_4_ = ABS(fVar197);
        auVar203._0_8_ = CONCAT44(fVar205,fVar204) & 0x7fffffff7fffffff;
        auVar203._8_4_ = ABS(fVar206);
        auVar203._12_4_ = ABS(fVar209);
        auVar61 = maxps(auVar236,auVar203);
        auVar168._0_8_ =
             CONCAT44(fVar193 * local_3f8 + fVar243 * local_2f8 + auVar92._4_4_,
                      fVar174 * local_3f8 + fVar214 * local_2f8 + auVar92._0_4_) &
             0x7fffffff7fffffff;
        auVar168._8_4_ = ABS(fVar195 * local_3f8 + fVar245 * local_2f8 + auVar92._8_4_);
        auVar168._12_4_ = ABS(fVar198 * local_3f8 + fVar247 * local_2f8 + auVar92._12_4_);
        auVar61 = maxps(auVar61,auVar168);
        uVar45 = -(uint)(local_308 <= auVar61._0_4_);
        uVar47 = -(uint)(local_308 <= auVar61._4_4_);
        uVar46 = -(uint)(local_308 <= auVar61._8_4_);
        uVar48 = -(uint)(local_308 <= auVar61._12_4_);
        fVar141 = (float)((uint)fVar175 & uVar45 | ~uVar45 & (uint)fVar239);
        fVar111 = (float)((uint)fVar194 & uVar47 | ~uVar47 & (uint)fVar240);
        fVar161 = (float)((uint)fVar196 & uVar46 | ~uVar46 & (uint)fVar172);
        fVar162 = (float)((uint)fVar197 & uVar48 | ~uVar48 & (uint)fVar173);
        fVar198 = (float)(~uVar45 & (uint)fVar231 | (uint)fVar204 & uVar45);
        fVar211 = (float)(~uVar47 & (uint)fVar232 | (uint)fVar205 & uVar47);
        fVar212 = (float)(~uVar46 & (uint)fVar233 | (uint)fVar206 & uVar46);
        fVar213 = (float)(~uVar48 & (uint)fVar234 | (uint)fVar209 & uVar48);
        auVar74._0_4_ = fVar151 * fVar151 + fVar140 * fVar140;
        auVar74._4_4_ = fVar160 * fVar160 + fVar149 * fVar149;
        auVar74._8_4_ = fVar123 * fVar123 + fVar150 * fVar150;
        auVar74._12_4_ = fVar170 * fVar170 + fVar210 * fVar210;
        auVar61 = rsqrtps(auVar92,auVar74);
        fVar110 = auVar61._0_4_;
        fVar121 = auVar61._4_4_;
        fVar125 = auVar61._8_4_;
        fVar139 = auVar61._12_4_;
        auVar93._0_4_ = fVar110 * fVar110 * auVar74._0_4_ * 0.5 * fVar110;
        auVar93._4_4_ = fVar121 * fVar121 * auVar74._4_4_ * 0.5 * fVar121;
        auVar93._8_4_ = fVar125 * fVar125 * auVar74._8_4_ * 0.5 * fVar125;
        auVar93._12_4_ = fVar139 * fVar139 * auVar74._12_4_ * 0.5 * fVar139;
        fVar214 = fVar110 * 1.5 - auVar93._0_4_;
        fVar231 = fVar121 * 1.5 - auVar93._4_4_;
        fVar232 = fVar125 * 1.5 - auVar93._8_4_;
        fVar233 = fVar139 * 1.5 - auVar93._12_4_;
        auVar75._0_4_ = fVar198 * fVar198 + fVar141 * fVar141;
        auVar75._4_4_ = fVar211 * fVar211 + fVar111 * fVar111;
        auVar75._8_4_ = fVar212 * fVar212 + fVar161 * fVar161;
        auVar75._12_4_ = fVar213 * fVar213 + fVar162 * fVar162;
        auVar61 = rsqrtps(auVar93,auVar75);
        fVar110 = auVar61._0_4_;
        fVar121 = auVar61._4_4_;
        fVar125 = auVar61._8_4_;
        fVar139 = auVar61._12_4_;
        fVar171 = fVar110 * 1.5 - fVar110 * fVar110 * auVar75._0_4_ * 0.5 * fVar110;
        fVar174 = fVar121 * 1.5 - fVar121 * fVar121 * auVar75._4_4_ * 0.5 * fVar121;
        fVar193 = fVar125 * 1.5 - fVar125 * fVar125 * auVar75._8_4_ * 0.5 * fVar125;
        fVar195 = fVar139 * 1.5 - fVar139 * fVar139 * auVar75._12_4_ * 0.5 * fVar139;
        fVar151 = fVar151 * fVar214 * local_2b8._0_4_;
        fVar160 = fVar160 * fVar231 * local_2b8._4_4_;
        fVar123 = fVar123 * fVar232 * local_2b8._8_4_;
        fVar170 = fVar170 * fVar233 * local_2b8._12_4_;
        local_1e8._0_4_ = local_2c8 + fVar151;
        local_1e8._4_4_ = fStack_2c4 + fVar160;
        fStack_1e0 = fStack_2c0 + fVar123;
        fStack_1dc = fStack_2bc + fVar170;
        fVar204 = -fVar140 * fVar214 * local_2b8._0_4_;
        fVar205 = -fVar149 * fVar231 * local_2b8._4_4_;
        fVar206 = -fVar150 * fVar232 * local_2b8._8_4_;
        fVar209 = -fVar210 * fVar233 * local_2b8._12_4_;
        local_3b8 = local_1c8 + fVar204;
        fStack_3b4 = fStack_1c4 + fVar205;
        fStack_3b0 = fStack_1c0 + fVar206;
        fStack_3ac = fStack_1bc + fVar209;
        fVar172 = fVar214 * 0.0 * local_2b8._0_4_;
        fVar173 = fVar231 * 0.0 * local_2b8._4_4_;
        fVar243 = fVar232 * 0.0 * local_2b8._8_4_;
        fVar245 = fVar233 * 0.0 * local_2b8._12_4_;
        local_3a8 = fVar249 + fVar172;
        fStack_3a4 = fVar120 + fVar173;
        fStack_3a0 = fVar122 + fVar243;
        fStack_39c = fVar124 + fVar245;
        fVar198 = fVar198 * fVar171 * (float)local_318._0_4_;
        fVar214 = fVar211 * fVar174 * (float)local_318._4_4_;
        fVar239 = fVar212 * fVar193 * fStack_310;
        fVar240 = fVar213 * fVar195 * fStack_30c;
        fVar125 = local_1b8 + fVar198;
        fVar140 = fStack_1b4 + fVar214;
        fVar149 = fStack_1b0 + fVar239;
        fVar150 = fStack_1ac + fVar240;
        fVar210 = -fVar141 * fVar171 * (float)local_318._0_4_;
        fVar211 = -fVar111 * fVar174 * (float)local_318._4_4_;
        fVar212 = -fVar161 * fVar193 * fStack_310;
        fVar213 = -fVar162 * fVar195 * fStack_30c;
        fVar110 = fVar218 + fVar210;
        fVar121 = fVar220 + fVar211;
        fVar139 = fVar222 + fVar212;
        fVar141 = fVar224 + fVar213;
        fVar111 = fVar171 * 0.0 * (float)local_318._0_4_;
        fVar161 = fVar174 * 0.0 * (float)local_318._4_4_;
        fVar162 = fVar193 * 0.0 * fStack_310;
        fVar171 = fVar195 * 0.0 * fStack_30c;
        fVar151 = local_2c8 - fVar151;
        fVar160 = fStack_2c4 - fVar160;
        fVar123 = fStack_2c0 - fVar123;
        fVar170 = fStack_2bc - fVar170;
        fVar231 = (float)local_448 + fVar111;
        fVar232 = local_448._4_4_ + fVar161;
        fVar233 = fStack_440 + fVar162;
        fVar234 = aStack_43c.field_0.x + fVar171;
        fVar204 = local_1c8 - fVar204;
        fVar205 = fStack_1c4 - fVar205;
        fVar206 = fStack_1c0 - fVar206;
        fVar209 = fStack_1bc - fVar209;
        fVar249 = fVar249 - fVar172;
        fVar120 = fVar120 - fVar173;
        fVar122 = fVar122 - fVar243;
        fVar124 = fVar124 - fVar245;
        uVar45 = -(uint)(0.0 < (fVar204 * (fVar231 - fVar249) - fVar249 * (fVar110 - fVar204)) * 0.0
                               + (fVar249 * (fVar125 - fVar151) - (fVar231 - fVar249) * fVar151) *
                                 0.0 + ((fVar110 - fVar204) * fVar151 -
                                       (fVar125 - fVar151) * fVar204));
        uVar47 = -(uint)(0.0 < (fVar205 * (fVar232 - fVar120) - fVar120 * (fVar121 - fVar205)) * 0.0
                               + (fVar120 * (fVar140 - fVar160) - (fVar232 - fVar120) * fVar160) *
                                 0.0 + ((fVar121 - fVar205) * fVar160 -
                                       (fVar140 - fVar160) * fVar205));
        uVar46 = -(uint)(0.0 < (fVar206 * (fVar233 - fVar122) - fVar122 * (fVar139 - fVar206)) * 0.0
                               + (fVar122 * (fVar149 - fVar123) - (fVar233 - fVar122) * fVar123) *
                                 0.0 + ((fVar139 - fVar206) * fVar123 -
                                       (fVar149 - fVar123) * fVar206));
        uVar48 = -(uint)(0.0 < (fVar209 * (fVar234 - fVar124) - fVar124 * (fVar141 - fVar209)) * 0.0
                               + (fVar124 * (fVar150 - fVar170) - (fVar234 - fVar124) * fVar170) *
                                 0.0 + ((fVar141 - fVar209) * fVar170 -
                                       (fVar150 - fVar170) * fVar209));
        fVar174 = (float)((uint)(local_1b8 - fVar198) & uVar45 | ~uVar45 & local_1e8._0_4_);
        fVar193 = (float)((uint)(fStack_1b4 - fVar214) & uVar47 | ~uVar47 & local_1e8._4_4_);
        fVar195 = (float)((uint)(fStack_1b0 - fVar239) & uVar46 | ~uVar46 & (uint)fStack_1e0);
        fVar198 = (float)((uint)(fStack_1ac - fVar240) & uVar48 | ~uVar48 & (uint)fStack_1dc);
        local_3c8._0_4_ = (uint)(fVar218 - fVar210) & uVar45 | ~uVar45 & (uint)local_3b8;
        local_3c8._4_4_ = (uint)(fVar220 - fVar211) & uVar47 | ~uVar47 & (uint)fStack_3b4;
        fStack_3c0 = (float)((uint)(fVar222 - fVar212) & uVar46 | ~uVar46 & (uint)fStack_3b0);
        fStack_3bc = (float)((uint)(fVar224 - fVar213) & uVar48 | ~uVar48 & (uint)fStack_3ac);
        fVar210 = (float)((uint)((float)local_448 - fVar111) & uVar45 | ~uVar45 & (uint)local_3a8);
        fVar211 = (float)((uint)(local_448._4_4_ - fVar161) & uVar47 | ~uVar47 & (uint)fStack_3a4);
        fVar212 = (float)((uint)(fStack_440 - fVar162) & uVar46 | ~uVar46 & (uint)fStack_3a0);
        fVar213 = (float)((uint)(aStack_43c.field_0.x - fVar171) & uVar48 |
                         ~uVar48 & (uint)fStack_39c);
        fVar111 = (float)((uint)fVar151 & uVar45 | ~uVar45 & (uint)fVar125);
        fVar161 = (float)((uint)fVar160 & uVar47 | ~uVar47 & (uint)fVar140);
        fVar162 = (float)((uint)fVar123 & uVar46 | ~uVar46 & (uint)fVar149);
        fVar171 = (float)((uint)fVar170 & uVar48 | ~uVar48 & (uint)fVar150);
        fVar214 = (float)((uint)fVar204 & uVar45 | ~uVar45 & (uint)fVar110);
        fVar218 = (float)((uint)fVar205 & uVar47 | ~uVar47 & (uint)fVar121);
        fVar220 = (float)((uint)fVar206 & uVar46 | ~uVar46 & (uint)fVar139);
        fVar222 = (float)((uint)fVar209 & uVar48 | ~uVar48 & (uint)fVar141);
        fVar239 = (float)((uint)fVar249 & uVar45 | ~uVar45 & (uint)fVar231);
        fVar240 = (float)((uint)fVar120 & uVar47 | ~uVar47 & (uint)fVar232);
        fVar172 = (float)((uint)fVar122 & uVar46 | ~uVar46 & (uint)fVar233);
        fVar173 = (float)((uint)fVar124 & uVar48 | ~uVar48 & (uint)fVar234);
        local_488._0_4_ = (float)((uint)fVar125 & uVar45 | ~uVar45 & (uint)fVar151) - fVar174;
        local_488._4_4_ = (float)((uint)fVar140 & uVar47 | ~uVar47 & (uint)fVar160) - fVar193;
        fStack_480 = (float)((uint)fVar149 & uVar46 | ~uVar46 & (uint)fVar123) - fVar195;
        fStack_47c = (float)((uint)fVar150 & uVar48 | ~uVar48 & (uint)fVar170) - fVar198;
        fVar110 = (float)((uint)fVar110 & uVar45 | ~uVar45 & (uint)fVar204) - (float)local_3c8._0_4_
        ;
        fVar125 = (float)((uint)fVar121 & uVar47 | ~uVar47 & (uint)fVar205) - (float)local_3c8._4_4_
        ;
        fVar140 = (float)((uint)fVar139 & uVar46 | ~uVar46 & (uint)fVar206) - fStack_3c0;
        fVar149 = (float)((uint)fVar141 & uVar48 | ~uVar48 & (uint)fVar209) - fStack_3bc;
        fVar204 = (float)((uint)fVar231 & uVar45 | ~uVar45 & (uint)fVar249) - fVar210;
        fVar205 = (float)((uint)fVar232 & uVar47 | ~uVar47 & (uint)fVar120) - fVar211;
        fVar206 = (float)((uint)fVar233 & uVar46 | ~uVar46 & (uint)fVar122) - fVar212;
        fVar209 = (float)((uint)fVar234 & uVar48 | ~uVar48 & (uint)fVar124) - fVar213;
        fVar234 = fVar174 - fVar111;
        fVar243 = fVar193 - fVar161;
        fVar245 = fVar195 - fVar162;
        fVar247 = fVar198 - fVar171;
        fVar151 = (float)local_3c8._0_4_ - fVar214;
        fVar160 = (float)local_3c8._4_4_ - fVar218;
        fVar123 = fStack_3c0 - fVar220;
        fVar170 = fStack_3bc - fVar222;
        fVar121 = fVar210 - fVar239;
        fVar139 = fVar211 - fVar240;
        fVar141 = fVar212 - fVar172;
        fVar150 = fVar213 - fVar173;
        fVar224 = ((float)local_3c8._0_4_ * fVar204 - fVar210 * fVar110) * 0.0 +
                  (fVar210 * (float)local_488._0_4_ - fVar174 * fVar204) * 0.0 +
                  (fVar174 * fVar110 - (float)local_3c8._0_4_ * (float)local_488._0_4_);
        fVar231 = ((float)local_3c8._4_4_ * fVar205 - fVar211 * fVar125) * 0.0 +
                  (fVar211 * (float)local_488._4_4_ - fVar193 * fVar205) * 0.0 +
                  (fVar193 * fVar125 - (float)local_3c8._4_4_ * (float)local_488._4_4_);
        auVar129._4_4_ = fVar231;
        auVar129._0_4_ = fVar224;
        fVar232 = (fStack_3c0 * fVar206 - fVar212 * fVar140) * 0.0 +
                  (fVar212 * fStack_480 - fVar195 * fVar206) * 0.0 +
                  (fVar195 * fVar140 - fStack_3c0 * fStack_480);
        fVar233 = (fStack_3bc * fVar209 - fVar213 * fVar149) * 0.0 +
                  (fVar213 * fStack_47c - fVar198 * fVar209) * 0.0 +
                  (fVar198 * fVar149 - fStack_3bc * fStack_47c);
        auVar241._0_4_ =
             (fVar214 * fVar121 - fVar239 * fVar151) * 0.0 +
             (fVar239 * fVar234 - fVar111 * fVar121) * 0.0 + (fVar111 * fVar151 - fVar214 * fVar234)
        ;
        auVar241._4_4_ =
             (fVar218 * fVar139 - fVar240 * fVar160) * 0.0 +
             (fVar240 * fVar243 - fVar161 * fVar139) * 0.0 + (fVar161 * fVar160 - fVar218 * fVar243)
        ;
        auVar241._8_4_ =
             (fVar220 * fVar141 - fVar172 * fVar123) * 0.0 +
             (fVar172 * fVar245 - fVar162 * fVar141) * 0.0 + (fVar162 * fVar123 - fVar220 * fVar245)
        ;
        auVar241._12_4_ =
             (fVar222 * fVar150 - fVar173 * fVar170) * 0.0 +
             (fVar173 * fVar247 - fVar171 * fVar150) * 0.0 + (fVar171 * fVar170 - fVar222 * fVar247)
        ;
        auVar129._8_4_ = fVar232;
        auVar129._12_4_ = fVar233;
        auVar61 = maxps(auVar129,auVar241);
        bVar28 = auVar61._0_4_ <= 0.0 && bVar28;
        auVar130._0_4_ = -(uint)bVar28;
        bVar29 = auVar61._4_4_ <= 0.0 && bVar29;
        auVar130._4_4_ = -(uint)bVar29;
        bVar27 = auVar61._8_4_ <= 0.0 && bVar27;
        auVar130._8_4_ = -(uint)bVar27;
        bVar26 = auVar61._12_4_ <= 0.0 && bVar26;
        auVar130._12_4_ = -(uint)bVar26;
        iVar30 = movmskps(iVar30,auVar130);
        if (iVar30 == 0) {
LAB_00a83df5:
          auVar131._8_8_ = uStack_330;
          auVar131._0_8_ = local_338;
        }
        else {
          fVar111 = (ray->super_RayK<1>).tfar;
          fVar171 = fVar151 * fVar204 - fVar121 * fVar110;
          fVar214 = fVar160 * fVar205 - fVar139 * fVar125;
          fVar218 = fVar123 * fVar206 - fVar141 * fVar140;
          fVar220 = fVar170 * fVar209 - fVar150 * fVar149;
          fVar161 = fVar121 * (float)local_488._0_4_ - fVar204 * fVar234;
          fVar162 = fVar139 * (float)local_488._4_4_ - fVar205 * fVar243;
          fVar141 = fVar141 * fStack_480 - fVar206 * fVar245;
          fVar150 = fVar150 * fStack_47c - fVar209 * fVar247;
          fVar151 = fVar234 * fVar110 - fVar151 * (float)local_488._0_4_;
          fVar160 = fVar243 * fVar125 - fVar160 * (float)local_488._4_4_;
          fVar123 = fVar245 * fVar140 - fVar123 * fStack_480;
          fVar170 = fVar247 * fVar149 - fVar170 * fStack_47c;
          auVar156._0_4_ = fVar171 * 0.0 + fVar161 * 0.0 + fVar151;
          auVar156._4_4_ = fVar214 * 0.0 + fVar162 * 0.0 + fVar160;
          auVar156._8_4_ = fVar218 * 0.0 + fVar141 * 0.0 + fVar123;
          auVar156._12_4_ = fVar220 * 0.0 + fVar150 * 0.0 + fVar170;
          auVar61 = rcpps(_local_488,auVar156);
          fVar110 = auVar61._0_4_;
          fVar121 = auVar61._4_4_;
          fVar125 = auVar61._8_4_;
          fVar139 = auVar61._12_4_;
          fVar110 = (1.0 - auVar156._0_4_ * fVar110) * fVar110 + fVar110;
          fVar121 = (1.0 - auVar156._4_4_ * fVar121) * fVar121 + fVar121;
          fVar125 = (1.0 - auVar156._8_4_ * fVar125) * fVar125 + fVar125;
          fVar139 = (1.0 - auVar156._12_4_ * fVar139) * fVar139 + fVar139;
          fVar140 = (fVar210 * fVar151 + (float)local_3c8._0_4_ * fVar161 + fVar174 * fVar171) *
                    fVar110;
          fVar149 = (fVar211 * fVar160 + (float)local_3c8._4_4_ * fVar162 + fVar193 * fVar214) *
                    fVar121;
          auVar216._4_4_ = fVar149;
          auVar216._0_4_ = fVar140;
          fVar141 = (fVar212 * fVar123 + fStack_3c0 * fVar141 + fVar195 * fVar218) * fVar125;
          fVar150 = (fVar213 * fVar170 + fStack_3bc * fVar150 + fVar198 * fVar220) * fVar139;
          bVar28 = (fVar140 <= fVar111 && fStack_1fc <= fVar140) && bVar28;
          auVar76._0_4_ = -(uint)bVar28;
          bVar29 = (fVar149 <= fVar111 && fStack_1fc <= fVar149) && bVar29;
          auVar76._4_4_ = -(uint)bVar29;
          bVar27 = (fVar141 <= fVar111 && fStack_1fc <= fVar141) && bVar27;
          auVar76._8_4_ = -(uint)bVar27;
          bVar26 = (fVar150 <= fVar111 && fStack_1fc <= fVar150) && bVar26;
          auVar76._12_4_ = -(uint)bVar26;
          iVar30 = movmskps(iVar30,auVar76);
          if (iVar30 == 0) goto LAB_00a83df5;
          auVar77._0_8_ =
               CONCAT44(-(uint)(auVar156._4_4_ != 0.0 && bVar29),
                        -(uint)(auVar156._0_4_ != 0.0 && bVar28));
          auVar77._8_4_ = -(uint)(auVar156._8_4_ != 0.0 && bVar27);
          auVar77._12_4_ = -(uint)(auVar156._12_4_ != 0.0 && bVar26);
          iVar30 = movmskps(iVar30,auVar77);
          auVar131._8_8_ = uStack_330;
          auVar131._0_8_ = local_338;
          if (iVar30 != 0) {
            fVar224 = fVar224 * fVar110;
            fVar231 = fVar231 * fVar121;
            fVar232 = fVar232 * fVar125;
            fVar233 = fVar233 * fVar139;
            auVar94._0_4_ = ~uVar45 & (uint)fVar224;
            auVar94._4_4_ = ~uVar47 & (uint)fVar231;
            auVar94._8_4_ = ~uVar46 & (uint)fVar232;
            auVar94._12_4_ = ~uVar48 & (uint)fVar233;
            auVar228._0_4_ = (uint)(1.0 - fVar224) & uVar45;
            auVar228._4_4_ = (uint)(1.0 - fVar231) & uVar47;
            auVar228._8_4_ = (uint)(1.0 - fVar232) & uVar46;
            auVar228._12_4_ = (uint)(1.0 - fVar233) & uVar48;
            auVar229 = auVar228 | auVar94;
            auVar131._8_4_ = auVar77._8_4_;
            auVar131._0_8_ = auVar77._0_8_;
            auVar131._12_4_ = auVar77._12_4_;
            auVar216._8_4_ = fVar141;
            auVar216._12_4_ = fVar150;
            local_1d8 = (float)(~uVar45 & (uint)(auVar241._0_4_ * fVar110) |
                               (uint)(1.0 - auVar241._0_4_ * fVar110) & uVar45);
            fStack_1d4 = (float)(~uVar47 & (uint)(auVar241._4_4_ * fVar121) |
                                (uint)(1.0 - auVar241._4_4_ * fVar121) & uVar47);
            fStack_1d0 = (float)(~uVar46 & (uint)(auVar241._8_4_ * fVar125) |
                                (uint)(1.0 - auVar241._8_4_ * fVar125) & uVar46);
            fStack_1cc = (float)(~uVar48 & (uint)(auVar241._12_4_ * fVar139) |
                                (uint)(1.0 - auVar241._12_4_ * fVar139) & uVar48);
            auVar133 = auVar216;
          }
        }
        uVar45 = movmskps(iVar30,auVar131);
        if (uVar45 != 0) {
          fVar121 = ((float)local_318._0_4_ - local_2b8._0_4_) * auVar229._0_4_ + local_2b8._0_4_;
          fVar125 = ((float)local_318._4_4_ - local_2b8._4_4_) * auVar229._4_4_ + local_2b8._4_4_;
          fVar139 = (fStack_310 - local_2b8._8_4_) * auVar229._8_4_ + local_2b8._8_4_;
          fVar140 = (fStack_30c - local_2b8._12_4_) * auVar229._12_4_ + local_2b8._12_4_;
          fVar110 = pre->depth_scale;
          auVar78._0_4_ = -(uint)(fVar110 * (fVar121 + fVar121) < auVar133._0_4_) & auVar131._0_4_;
          auVar78._4_4_ = -(uint)(fVar110 * (fVar125 + fVar125) < auVar133._4_4_) & auVar131._4_4_;
          auVar78._8_4_ = -(uint)(fVar110 * (fVar139 + fVar139) < auVar133._8_4_) & auVar131._8_4_;
          auVar78._12_4_ =
               -(uint)(fVar110 * (fVar140 + fVar140) < auVar133._12_4_) & auVar131._12_4_;
          uVar45 = movmskps(uVar45,auVar78);
          if (uVar45 != 0) {
            local_1d8 = local_1d8 + local_1d8 + -1.0;
            fStack_1d4 = fStack_1d4 + fStack_1d4 + -1.0;
            fStack_1d0 = fStack_1d0 + fStack_1d0 + -1.0;
            fStack_1cc = fStack_1cc + fStack_1cc + -1.0;
            _local_198 = auVar229;
            local_188 = local_1d8;
            fStack_184 = fStack_1d4;
            fStack_180 = fStack_1d0;
            fStack_17c = fStack_1cc;
            _local_178 = auVar133;
            local_168 = 0;
            local_164 = iVar6;
            local_158 = *(undefined8 *)pfVar1;
            uStack_150 = *(undefined8 *)(pfVar1 + 2);
            local_148 = fVar109;
            fStack_144 = fVar50;
            fStack_140 = fVar85;
            fStack_13c = fStack_3fc;
            local_138 = fVar86;
            fStack_134 = fVar87;
            fStack_130 = fVar108;
            fStack_12c = fStack_40c;
            local_128 = *(undefined8 *)pfVar2;
            uStack_120 = *(undefined8 *)(pfVar2 + 2);
            local_118 = auVar78;
            uVar45 = (ray->super_RayK<1>).mask;
            if ((pGVar39->mask & uVar45) != 0) {
              local_388 = auVar78;
              fVar119 = 1.0 / fVar119;
              local_108[0] = fVar119 * (auVar229._0_4_ + 0.0);
              local_108[1] = fVar119 * (auVar229._4_4_ + 1.0);
              local_108[2] = fVar119 * (auVar229._8_4_ + 2.0);
              local_108[3] = fVar119 * (auVar229._12_4_ + 3.0);
              local_f8 = CONCAT44(fStack_1d4,local_1d8);
              uStack_f0 = CONCAT44(fStack_1cc,fStack_1d0);
              _local_e8 = auVar133;
              auVar95._0_4_ = auVar78._0_4_ & (uint)auVar133._0_4_;
              auVar95._4_4_ = auVar78._4_4_ & (uint)auVar133._4_4_;
              auVar95._8_4_ = auVar78._8_4_ & (uint)auVar133._8_4_;
              auVar95._12_4_ = auVar78._12_4_ & (uint)auVar133._12_4_;
              auVar112._0_8_ = CONCAT44(~auVar78._4_4_,~auVar78._0_4_) & 0x7f8000007f800000;
              auVar112._8_4_ = ~auVar78._8_4_ & 0x7f800000;
              auVar112._12_4_ = ~auVar78._12_4_ & 0x7f800000;
              auVar112 = auVar112 | auVar95;
              auVar132._4_4_ = auVar112._0_4_;
              auVar132._0_4_ = auVar112._4_4_;
              auVar132._8_4_ = auVar112._12_4_;
              auVar132._12_4_ = auVar112._8_4_;
              auVar61 = minps(auVar132,auVar112);
              auVar96._0_8_ = auVar61._8_8_;
              auVar96._8_4_ = auVar61._0_4_;
              auVar96._12_4_ = auVar61._4_4_;
              auVar61 = minps(auVar96,auVar61);
              auVar97._0_8_ =
                   CONCAT44(-(uint)(auVar61._4_4_ == auVar112._4_4_) & auVar78._4_4_,
                            -(uint)(auVar61._0_4_ == auVar112._0_4_) & auVar78._0_4_);
              auVar97._8_4_ = -(uint)(auVar61._8_4_ == auVar112._8_4_) & auVar78._8_4_;
              auVar97._12_4_ = -(uint)(auVar61._12_4_ == auVar112._12_4_) & auVar78._12_4_;
              iVar30 = movmskps(uVar45,auVar97);
              if (iVar30 != 0) {
                auVar78._8_4_ = auVar97._8_4_;
                auVar78._0_8_ = auVar97._0_8_;
                auVar78._12_4_ = auVar97._12_4_;
              }
              uVar45 = movmskps(iVar30,auVar78);
              lVar38 = 0;
              if (uVar45 != 0) {
                for (; (uVar45 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar39->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar110 = local_108[lVar38];
                fVar121 = 1.0 - fVar110;
                fVar119 = fVar110 * 3.0;
                fVar140 = ((fVar119 + 2.0) * (fVar121 + fVar121) + fVar121 * -3.0 * fVar121) * 0.5;
                fVar125 = (fVar121 * -2.0 * fVar110 + fVar110 * fVar110) * 0.5;
                fVar139 = (fVar110 * fVar119 + (fVar119 + -5.0) * (fVar110 + fVar110)) * 0.5;
                fVar119 = *(float *)((long)&local_f8 + lVar38 * 4);
                fVar121 = (fVar110 * (fVar121 + fVar121) - fVar121 * fVar121) * 0.5;
                (ray->super_RayK<1>).tfar = *(float *)(local_e8 + lVar38 * 4);
                *(ulong *)&(ray->Ng).field_0 =
                     CONCAT44(fVar121 * fStack_394 +
                              fVar139 * fVar50 + fVar140 * fVar87 + fVar125 * fStack_324,
                              fVar121 * local_398 +
                              fVar139 * fVar109 + fVar140 * fVar86 + fVar125 * local_328);
                (ray->Ng).field_0.field_0.z =
                     fVar121 * fStack_390 +
                     fVar139 * fVar85 + fVar140 * fVar108 + fVar125 * fStack_320;
                ray->u = fVar110;
                ray->v = fVar119;
                ray->primID = uVar44;
                ray->geomID = uVar43;
                ray->instID[0] = context->user->instID[0];
                uVar45 = context->user->instPrimID[0];
                ray->instPrimID[0] = uVar45;
                pre = local_378;
                prim = local_370;
              }
              else {
                _local_488 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
                local_458 = auVar229;
                local_46c._4_16_ = auVar133;
LAB_00a84e62:
                local_23c = local_108[lVar38];
                local_238 = *(undefined4 *)((long)&local_f8 + lVar38 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_e8 + lVar38 * 4);
                fVar110 = 1.0 - local_23c;
                fVar121 = local_23c * 3.0;
                fVar125 = ((fVar121 + 2.0) * (fVar110 + fVar110) + fVar110 * -3.0 * fVar110) * 0.5;
                fVar119 = (fVar110 * -2.0 * local_23c + local_23c * local_23c) * 0.5;
                fVar121 = (local_23c * fVar121 + (fVar121 + -5.0) * (local_23c + local_23c)) * 0.5;
                fVar110 = (local_23c * (fVar110 + fVar110) - fVar110 * fVar110) * 0.5;
                local_368.context = context->user;
                local_248 = CONCAT44(fVar110 * fStack_394 +
                                     fVar121 * fVar50 + fVar125 * fVar87 + fVar119 * fStack_324,
                                     fVar110 * local_398 +
                                     fVar121 * fVar109 + fVar125 * fVar86 + fVar119 * local_328);
                local_240 = fVar110 * fStack_390 +
                            fVar121 * fVar85 + fVar125 * fVar108 + fVar119 * fStack_320;
                local_234 = (int)local_3e0;
                local_230 = (int)local_420;
                local_22c = (local_368.context)->instID[0];
                local_228 = (local_368.context)->instPrimID[0];
                local_46c._0_4_ = -NAN;
                local_368.valid = (int *)local_46c;
                local_368.geometryUserPtr = pGVar39->userPtr;
                local_368.ray = (RTCRayN *)ray;
                local_368.hit = (RTCHitN *)&local_248;
                local_368.N = 1;
                if ((pGVar39->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*pGVar39->intersectionFilterN)(&local_368), p_Var37 = extraout_RDX_01,
                   context = local_3e8, auVar133 = local_46c._4_16_, auVar229 = local_458,
                   fVar86 = local_418, fVar87 = fStack_414, fVar108 = fStack_410,
                   fVar109 = local_408, fVar50 = fStack_404, fVar85 = fStack_400,
                   (((RayK<1> *)local_368.valid)->org).field_0.m128[0] != 0.0)) {
                  p_Var37 = context->args->filter;
                  if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                     ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                        RTC_RAY_QUERY_FLAG_INCOHERENT ||
                       (((pGVar39->field_8).field_0x2 & 0x40) != 0)) &&
                      ((*p_Var37)(&local_368), p_Var37 = extraout_RDX_02, context = local_3e8,
                      auVar133 = local_46c._4_16_, auVar229 = local_458, fVar86 = local_418,
                      fVar87 = fStack_414, fVar108 = fStack_410, fVar109 = local_408,
                      fVar50 = fStack_404, fVar85 = fStack_400,
                      (((RayK<1> *)local_368.valid)->org).field_0.m128[0] == 0.0))))
                  goto LAB_00a850fc;
                  (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_368.hit;
                  (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_368.hit + 4);
                  (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_368.hit + 8);
                  *(float *)((long)local_368.ray + 0x3c) = *(float *)(local_368.hit + 0xc);
                  *(float *)((long)local_368.ray + 0x40) = *(float *)(local_368.hit + 0x10);
                  *(float *)((long)local_368.ray + 0x44) = *(float *)(local_368.hit + 0x14);
                  *(float *)((long)local_368.ray + 0x48) = *(float *)(local_368.hit + 0x18);
                  p_Var37 = (RTCFilterFunctionN)(ulong)(uint)*(float *)(local_368.hit + 0x1c);
                  *(float *)((long)local_368.ray + 0x4c) = *(float *)(local_368.hit + 0x1c);
                  *(float *)((long)local_368.ray + 0x50) = *(float *)(local_368.hit + 0x20);
                  pRVar35 = (RayHit *)local_368.ray;
                }
                else {
LAB_00a850fc:
                  (ray->super_RayK<1>).tfar = (float)local_488._0_4_;
                  pRVar35 = (RayHit *)local_368.valid;
                  context = local_3e8;
                  auVar133 = local_46c._4_16_;
                  auVar229 = local_458;
                  fVar86 = local_418;
                  fVar87 = fStack_414;
                  fVar108 = fStack_410;
                  fVar109 = local_408;
                  fVar50 = fStack_404;
                  fVar85 = fStack_400;
                }
                *(undefined4 *)(local_388 + lVar38 * 4) = 0;
                fVar110 = (ray->super_RayK<1>).tfar;
                local_488._0_4_ = (ray->super_RayK<1>).tfar;
                local_488._4_4_ = (ray->super_RayK<1>).mask;
                fStack_480 = (float)(ray->super_RayK<1>).id;
                fStack_47c = (float)(ray->super_RayK<1>).flags;
                auVar82._0_4_ = -(uint)(auVar133._0_4_ <= fVar110) & local_388._0_4_;
                auVar82._4_4_ = -(uint)(auVar133._4_4_ <= fVar110) & local_388._4_4_;
                auVar82._8_4_ = -(uint)(auVar133._8_4_ <= fVar110) & local_388._8_4_;
                auVar82._12_4_ = -(uint)(auVar133._12_4_ <= fVar110) & local_388._12_4_;
                local_388 = auVar82;
                uVar45 = movmskps((int)pRVar35,auVar82);
                pre = local_378;
                prim = local_370;
                if (uVar45 != 0) {
                  auVar105._0_4_ = auVar82._0_4_ & (uint)auVar133._0_4_;
                  auVar105._4_4_ = auVar82._4_4_ & (uint)auVar133._4_4_;
                  auVar105._8_4_ = auVar82._8_4_ & (uint)auVar133._8_4_;
                  auVar105._12_4_ = auVar82._12_4_ & (uint)auVar133._12_4_;
                  auVar118._0_8_ = CONCAT44(~auVar82._4_4_,~auVar82._0_4_) & 0x7f8000007f800000;
                  auVar118._8_4_ = ~auVar82._8_4_ & 0x7f800000;
                  auVar118._12_4_ = ~auVar82._12_4_ & 0x7f800000;
                  auVar118 = auVar118 | auVar105;
                  auVar138._4_4_ = auVar118._0_4_;
                  auVar138._0_4_ = auVar118._4_4_;
                  auVar138._8_4_ = auVar118._12_4_;
                  auVar138._12_4_ = auVar118._8_4_;
                  auVar61 = minps(auVar138,auVar118);
                  auVar106._0_8_ = auVar61._8_8_;
                  auVar106._8_4_ = auVar61._0_4_;
                  auVar106._12_4_ = auVar61._4_4_;
                  auVar61 = minps(auVar106,auVar61);
                  auVar107._0_8_ =
                       CONCAT44(-(uint)(auVar61._4_4_ == auVar118._4_4_) & auVar82._4_4_,
                                -(uint)(auVar61._0_4_ == auVar118._0_4_) & auVar82._0_4_);
                  auVar107._8_4_ = -(uint)(auVar61._8_4_ == auVar118._8_4_) & auVar82._8_4_;
                  auVar107._12_4_ = -(uint)(auVar61._12_4_ == auVar118._12_4_) & auVar82._12_4_;
                  iVar30 = movmskps(uVar45,auVar107);
                  if (iVar30 != 0) {
                    auVar82._8_4_ = auVar107._8_4_;
                    auVar82._0_8_ = auVar107._0_8_;
                    auVar82._12_4_ = auVar107._12_4_;
                  }
                  uVar32 = movmskps(iVar30,auVar82);
                  uVar40 = CONCAT44((int)((ulong)pRVar35 >> 0x20),uVar32);
                  lVar38 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                    }
                  }
                  goto LAB_00a84e62;
                }
              }
            }
          }
        }
      }
      local_46c._4_16_ = auVar133;
      local_458 = auVar229;
      if (4 < iVar6) {
        local_68 = iVar6;
        iStack_64 = iVar6;
        iStack_60 = iVar6;
        iStack_5c = iVar6;
        fStack_304 = local_308;
        fStack_300 = local_308;
        fStack_2fc = local_308;
        local_208 = fStack_1fc;
        fStack_204 = fStack_1fc;
        fStack_200 = fStack_1fc;
        local_88 = 1.0 / (float)local_218._0_4_;
        fStack_84 = local_88;
        fStack_80 = local_88;
        fStack_7c = local_88;
        lVar38 = 4;
        do {
          local_168 = (uint)lVar38;
          pfVar1 = (float *)(catmullrom_basis0 + lVar38 * 4 + lVar33);
          local_2d8 = *pfVar1;
          fStack_2d4 = pfVar1[1];
          fStack_2d0 = pfVar1[2];
          fStack_2cc = pfVar1[3];
          pfVar1 = (float *)(lVar33 + 0x21b37f0 + lVar38 * 4);
          local_3a8 = *pfVar1;
          fStack_3a4 = pfVar1[1];
          fStack_3a0 = pfVar1[2];
          fStack_39c = pfVar1[3];
          pfVar1 = (float *)(lVar33 + 0x21b3c74 + lVar38 * 4);
          local_3b8 = *pfVar1;
          fStack_3b4 = pfVar1[1];
          fStack_3b0 = pfVar1[2];
          fStack_3ac = pfVar1[3];
          pfVar1 = (float *)(lVar33 + 0x21b40f8 + lVar38 * 4);
          fVar109 = *pfVar1;
          fVar50 = pfVar1[1];
          fVar85 = pfVar1[2];
          fVar86 = pfVar1[3];
          local_1c8 = local_98 * local_2d8 +
                      local_2a8 * local_3a8 + local_258 * local_3b8 + local_3d8 * fVar109;
          fStack_1c4 = fStack_94 * fStack_2d4 +
                       fStack_2a4 * fStack_3a4 + fStack_254 * fStack_3b4 + fStack_3d4 * fVar50;
          fStack_1c0 = fStack_90 * fStack_2d0 +
                       fStack_2a0 * fStack_3a0 + fStack_250 * fStack_3b0 + fStack_3d0 * fVar85;
          fStack_1bc = fStack_8c * fStack_2cc +
                       fStack_29c * fStack_39c + fStack_24c * fStack_3ac + fStack_3cc * fVar86;
          local_1b8 = local_1a8 * local_2d8 +
                      aStack_43c.field_0.y * local_3a8 + local_268 * local_3b8 + local_278 * fVar109
          ;
          fStack_1b4 = fStack_1a4 * fStack_2d4 +
                       aStack_43c.field_0.z * fStack_3a4 +
                       fStack_264 * fStack_3b4 + fStack_274 * fVar50;
          fStack_1b0 = fStack_1a0 * fStack_2d0 +
                       fStack_430 * fStack_3a0 + fStack_260 * fStack_3b0 + fStack_270 * fVar85;
          fStack_1ac = fStack_19c * fStack_2cc +
                       fStack_42c * fStack_39c + fStack_25c * fStack_3ac + fStack_26c * fVar86;
          local_3c8._0_4_ =
               local_d8 * local_2d8 +
               local_c8 * local_3a8 + local_a8 * local_3b8 + local_b8 * fVar109;
          local_3c8._4_4_ =
               fStack_d4 * fStack_2d4 +
               fStack_c4 * fStack_3a4 + fStack_a4 * fStack_3b4 + fStack_b4 * fVar50;
          fStack_3c0 = fStack_d0 * fStack_2d0 +
                       fStack_c0 * fStack_3a0 + fStack_a0 * fStack_3b0 + fStack_b0 * fVar85;
          fStack_3bc = fStack_cc * fStack_2cc +
                       fStack_bc * fStack_39c + fStack_9c * fStack_3ac + fStack_ac * fVar86;
          puVar34 = catmullrom_basis1 + lVar33;
          pfVar1 = (float *)(puVar34 + lVar38 * 4);
          fVar87 = *pfVar1;
          fVar108 = pfVar1[1];
          fVar110 = pfVar1[2];
          fVar119 = pfVar1[3];
          pfVar1 = (float *)(lVar33 + 0x21b5c10 + lVar38 * 4);
          fVar121 = *pfVar1;
          fVar125 = pfVar1[1];
          fVar139 = pfVar1[2];
          fVar140 = pfVar1[3];
          pfVar1 = (float *)(lVar33 + 0x21b6094 + lVar38 * 4);
          fVar141 = *pfVar1;
          fVar149 = pfVar1[1];
          fVar150 = pfVar1[2];
          fVar151 = pfVar1[3];
          pauVar4 = (undefined1 (*) [12])(lVar33 + 0x21b6518 + lVar38 * 4);
          fVar111 = *(float *)*pauVar4;
          fVar160 = *(float *)(*pauVar4 + 4);
          fVar161 = *(float *)(*pauVar4 + 8);
          auVar11 = *pauVar4;
          fVar123 = *(float *)pauVar4[1];
          local_318._0_4_ =
               local_98 * fVar87 + local_2a8 * fVar121 + local_258 * fVar141 + local_3d8 * fVar111;
          local_318._4_4_ =
               fStack_94 * fVar108 +
               fStack_2a4 * fVar125 + fStack_254 * fVar149 + fStack_3d4 * fVar160;
          fStack_310 = fStack_90 * fVar110 +
                       fStack_2a0 * fVar139 + fStack_250 * fVar150 + fStack_3d0 * fVar161;
          fStack_30c = fStack_8c * fVar119 +
                       fStack_29c * fVar140 + fStack_24c * fVar151 + fStack_3cc * fVar123;
          fVar170 = local_1a8 * fVar87 +
                    aStack_43c.field_0.y * fVar121 + local_268 * fVar141 + local_278 * fVar111;
          fVar171 = fStack_1a4 * fVar108 +
                    aStack_43c.field_0.z * fVar125 + fStack_264 * fVar149 + fStack_274 * fVar160;
          fVar174 = fStack_1a0 * fVar110 +
                    fStack_430 * fVar139 + fStack_260 * fVar150 + fStack_270 * fVar161;
          fVar193 = fStack_19c * fVar119 +
                    fStack_42c * fVar140 + fStack_25c * fVar151 + fStack_26c * fVar123;
          local_2b8._0_4_ =
               local_d8 * fVar87 + local_c8 * fVar121 + local_a8 * fVar141 + local_b8 * fVar111;
          local_2b8._4_4_ =
               fStack_d4 * fVar108 + fStack_c4 * fVar125 + fStack_a4 * fVar149 + fStack_b4 * fVar160
          ;
          local_2b8._8_4_ =
               fStack_d0 * fVar110 + fStack_c0 * fVar139 + fStack_a0 * fVar150 + fStack_b0 * fVar161
          ;
          local_2b8._12_4_ =
               fStack_cc * fVar119 + fStack_bc * fVar140 + fStack_9c * fVar151 + fStack_ac * fVar123
          ;
          fVar111 = (float)local_318._0_4_ - local_1c8;
          fVar160 = (float)local_318._4_4_ - fStack_1c4;
          fVar161 = fStack_310 - fStack_1c0;
          fVar162 = fStack_30c - fStack_1bc;
          local_218._0_4_ = fVar170 - local_1b8;
          local_218._4_4_ = fVar171 - fStack_1b4;
          fStack_210 = fVar174 - fStack_1b0;
          fStack_20c = fVar193 - fStack_1ac;
          fVar195 = local_1b8 * fVar111 - local_1c8 * (float)local_218._0_4_;
          fVar198 = fStack_1b4 * fVar160 - fStack_1c4 * (float)local_218._4_4_;
          fVar204 = fStack_1b0 * fVar161 - fStack_1c0 * fStack_210;
          fVar205 = fStack_1ac * fVar162 - fStack_1bc * fStack_20c;
          auVar133 = maxps(_local_3c8,local_2b8);
          bVar27 = fVar195 * fVar195 <=
                   auVar133._0_4_ * auVar133._0_4_ *
                   (fVar111 * fVar111 + (float)local_218._0_4_ * (float)local_218._0_4_) &&
                   (int)local_168 < local_68;
          local_1e8._0_4_ = -(uint)bVar27;
          bVar26 = (int)(local_168 | 1) < iStack_64 &&
                   fVar198 * fVar198 <=
                   auVar133._4_4_ * auVar133._4_4_ *
                   (fVar160 * fVar160 + (float)local_218._4_4_ * (float)local_218._4_4_);
          local_1e8._4_4_ = -(uint)bVar26;
          bVar28 = fVar204 * fVar204 <=
                   auVar133._8_4_ * auVar133._8_4_ * (fVar161 * fVar161 + fStack_210 * fStack_210)
                   && (int)(local_168 | 2) < iStack_60;
          fStack_1e0 = (float)-(uint)bVar28;
          bVar29 = fVar205 * fVar205 <=
                   auVar133._12_4_ * auVar133._12_4_ * (fVar162 * fVar162 + fStack_20c * fStack_20c)
                   && (int)(local_168 | 3) < iStack_5c;
          fStack_1dc = (float)-(uint)bVar29;
          uVar43 = movmskps((int)p_Var37,_local_1e8);
          p_Var37 = (RTCFilterFunctionN)(ulong)uVar43;
          if (uVar43 != 0) {
            local_58 = fVar111;
            fStack_54 = fVar160;
            fStack_50 = fVar161;
            fStack_4c = fVar162;
            local_488._0_4_ = auVar11._0_4_;
            local_488._4_4_ = auVar11._4_4_;
            fStack_480 = auVar11._8_4_;
            fVar239 = (float)local_488._0_4_ * local_298 + fVar141 * local_288 + fVar121 * local_2f8
                      + fVar87 * local_3f8;
            fVar240 = (float)local_488._4_4_ * fStack_294 + fVar149 * fStack_284 +
                      fVar125 * fStack_2f4 + fVar108 * fStack_3f4;
            fVar172 = fStack_480 * fStack_290 + fVar150 * fStack_280 + fVar139 * fStack_2f0 +
                      fVar110 * fStack_3f0;
            fVar173 = fVar123 * fStack_28c + fVar151 * fStack_27c + fVar140 * fStack_2ec +
                      fVar119 * fStack_3ec;
            fVar243 = fVar109 * local_298 + local_3b8 * local_288 + local_3a8 * local_2f8 +
                      local_2d8 * local_3f8;
            fVar245 = fVar50 * fStack_294 + fStack_3b4 * fStack_284 + fStack_3a4 * fStack_2f4 +
                      fStack_2d4 * fStack_3f4;
            fVar247 = fVar85 * fStack_290 + fStack_3b0 * fStack_280 + fStack_3a0 * fStack_2f0 +
                      fStack_2d0 * fStack_3f0;
            fVar249 = fVar86 * fStack_28c + fStack_3ac * fStack_27c + fStack_39c * fStack_2ec +
                      fStack_2cc * fStack_3ec;
            pfVar1 = (float *)(lVar33 + 0x21b457c + lVar38 * 4);
            fVar109 = *pfVar1;
            fVar50 = pfVar1[1];
            fVar85 = pfVar1[2];
            fVar86 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x21b4a00 + lVar38 * 4);
            fVar87 = *pfVar1;
            fVar108 = pfVar1[1];
            fVar110 = pfVar1[2];
            fVar119 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x21b4e84 + lVar38 * 4);
            fVar121 = *pfVar1;
            fVar125 = pfVar1[1];
            fVar139 = pfVar1[2];
            fVar140 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x21b5308 + lVar38 * 4);
            fVar141 = *pfVar1;
            fVar149 = pfVar1[1];
            fVar150 = pfVar1[2];
            fVar151 = pfVar1[3];
            fVar120 = local_98 * fVar109 +
                      local_2a8 * fVar87 + local_258 * fVar121 + local_3d8 * fVar141;
            fVar122 = fStack_94 * fVar50 +
                      fStack_2a4 * fVar108 + fStack_254 * fVar125 + fStack_3d4 * fVar149;
            fVar124 = fStack_90 * fVar85 +
                      fStack_2a0 * fVar110 + fStack_250 * fVar139 + fStack_3d0 * fVar150;
            fVar175 = fStack_8c * fVar86 +
                      fStack_29c * fVar119 + fStack_24c * fVar140 + fStack_3cc * fVar151;
            fVar231 = local_1a8 * fVar109 +
                      aStack_43c.field_0.y * fVar87 + local_268 * fVar121 + local_278 * fVar141;
            fVar232 = fStack_1a4 * fVar50 +
                      aStack_43c.field_0.z * fVar108 + fStack_264 * fVar125 + fStack_274 * fVar149;
            fVar233 = fStack_1a0 * fVar85 +
                      fStack_430 * fVar110 + fStack_260 * fVar139 + fStack_270 * fVar150;
            fVar234 = fStack_19c * fVar86 +
                      fStack_42c * fVar119 + fStack_25c * fVar140 + fStack_26c * fVar151;
            pfVar1 = (float *)(lVar33 + 0x21b699c + lVar38 * 4);
            fVar123 = *pfVar1;
            fVar195 = pfVar1[1];
            fVar198 = pfVar1[2];
            fVar204 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x21b72a4 + lVar38 * 4);
            fVar205 = *pfVar1;
            fVar206 = pfVar1[1];
            fVar209 = pfVar1[2];
            fVar210 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x21b7728 + lVar38 * 4);
            fVar211 = *pfVar1;
            fVar212 = pfVar1[1];
            fVar213 = pfVar1[2];
            fVar214 = pfVar1[3];
            pfVar1 = (float *)(lVar33 + 0x21b6e20 + lVar38 * 4);
            fVar218 = *pfVar1;
            fVar220 = pfVar1[1];
            fVar222 = pfVar1[2];
            fVar224 = pfVar1[3];
            fVar194 = local_98 * fVar123 +
                      local_2a8 * fVar218 + local_258 * fVar205 + local_3d8 * fVar211;
            fVar196 = fStack_94 * fVar195 +
                      fStack_2a4 * fVar220 + fStack_254 * fVar206 + fStack_3d4 * fVar212;
            fVar197 = fStack_90 * fVar198 +
                      fStack_2a0 * fVar222 + fStack_250 * fVar209 + fStack_3d0 * fVar213;
            fVar215 = fStack_8c * fVar204 +
                      fStack_29c * fVar224 + fStack_24c * fVar210 + fStack_3cc * fVar214;
            fVar219 = local_1a8 * fVar123 +
                      aStack_43c.field_0.y * fVar218 + local_268 * fVar205 + local_278 * fVar211;
            fVar221 = fStack_1a4 * fVar195 +
                      aStack_43c.field_0.z * fVar220 + fStack_264 * fVar206 + fStack_274 * fVar212;
            fVar223 = fStack_1a0 * fVar198 +
                      fStack_430 * fVar222 + fStack_260 * fVar209 + fStack_270 * fVar213;
            fVar244 = fStack_19c * fVar204 +
                      fStack_42c * fVar224 + fStack_25c * fVar210 + fStack_26c * fVar214;
            auVar230._0_8_ = CONCAT44(fVar122,fVar120) & 0x7fffffff7fffffff;
            auVar230._8_4_ = ABS(fVar124);
            auVar230._12_4_ = ABS(fVar175);
            auVar157._0_8_ = CONCAT44(fVar232,fVar231) & 0x7fffffff7fffffff;
            auVar157._8_4_ = ABS(fVar233);
            auVar157._12_4_ = ABS(fVar234);
            auVar133 = maxps(auVar230,auVar157);
            auVar237._0_8_ =
                 CONCAT44(fVar50 * fStack_3f4 +
                          fVar108 * fStack_2f4 + fVar125 * fStack_284 + fVar149 * fStack_294,
                          fVar109 * local_3f8 +
                          fVar87 * local_2f8 + fVar121 * local_288 + fVar141 * local_298) &
                 0x7fffffff7fffffff;
            auVar237._8_4_ =
                 ABS(fVar85 * fStack_3f0 +
                     fVar110 * fStack_2f0 + fVar139 * fStack_280 + fVar150 * fStack_290);
            auVar237._12_4_ =
                 ABS(fVar86 * fStack_3ec +
                     fVar119 * fStack_2ec + fVar140 * fStack_27c + fVar151 * fStack_28c);
            auVar133 = maxps(auVar133,auVar237);
            uVar43 = -(uint)(local_308 <= auVar133._0_4_);
            uVar44 = -(uint)(fStack_304 <= auVar133._4_4_);
            uVar45 = -(uint)(fStack_300 <= auVar133._8_4_);
            uVar47 = -(uint)(fStack_2fc <= auVar133._12_4_);
            auVar158._0_4_ = ~uVar43 & (uint)fVar111;
            auVar158._4_4_ = ~uVar44 & (uint)fVar160;
            auVar158._8_4_ = ~uVar45 & (uint)fVar161;
            auVar158._12_4_ = ~uVar47 & (uint)fVar162;
            auVar217._0_4_ = (uint)fVar120 & uVar43;
            auVar217._4_4_ = (uint)fVar122 & uVar44;
            auVar217._8_4_ = (uint)fVar124 & uVar45;
            auVar217._12_4_ = (uint)fVar175 & uVar47;
            auVar217 = auVar217 | auVar158;
            fVar125 = (float)(~uVar43 & local_218._0_4_ | (uint)fVar231 & uVar43);
            fVar140 = (float)(~uVar44 & local_218._4_4_ | (uint)fVar232 & uVar44);
            fVar231 = (float)(~uVar45 & (uint)fStack_210 | (uint)fVar233 & uVar45);
            fVar232 = (float)(~uVar47 & (uint)fStack_20c | (uint)fVar234 & uVar47);
            auVar238._0_8_ = CONCAT44(fVar196,fVar194) & 0x7fffffff7fffffff;
            auVar238._8_4_ = ABS(fVar197);
            auVar238._12_4_ = ABS(fVar215);
            auVar113._0_8_ = CONCAT44(fVar221,fVar219) & 0x7fffffff7fffffff;
            auVar113._8_4_ = ABS(fVar223);
            auVar113._12_4_ = ABS(fVar244);
            auVar133 = maxps(auVar238,auVar113);
            auVar79._0_8_ =
                 CONCAT44(fVar195 * fStack_3f4 +
                          fVar220 * fStack_2f4 + fVar206 * fStack_284 + fVar212 * fStack_294,
                          fVar123 * local_3f8 +
                          fVar218 * local_2f8 + fVar205 * local_288 + fVar211 * local_298) &
                 0x7fffffff7fffffff;
            auVar79._8_4_ =
                 ABS(fVar198 * fStack_3f0 +
                     fVar222 * fStack_2f0 + fVar209 * fStack_280 + fVar213 * fStack_290);
            auVar79._12_4_ =
                 ABS(fVar204 * fStack_3ec +
                     fVar224 * fStack_2ec + fVar210 * fStack_27c + fVar214 * fStack_28c);
            auVar133 = maxps(auVar133,auVar79);
            uVar43 = -(uint)(local_308 <= auVar133._0_4_);
            uVar44 = -(uint)(fStack_304 <= auVar133._4_4_);
            uVar45 = -(uint)(fStack_300 <= auVar133._8_4_);
            uVar47 = -(uint)(fStack_2fc <= auVar133._12_4_);
            fVar218 = (float)((uint)fVar194 & uVar43 | ~uVar43 & (uint)fVar111);
            fVar220 = (float)((uint)fVar196 & uVar44 | ~uVar44 & (uint)fVar160);
            fVar222 = (float)((uint)fVar197 & uVar45 | ~uVar45 & (uint)fVar161);
            fVar224 = (float)((uint)fVar215 & uVar47 | ~uVar47 & (uint)fVar162);
            fVar111 = (float)(~uVar43 & local_218._0_4_ | (uint)fVar219 & uVar43);
            fVar161 = (float)(~uVar44 & local_218._4_4_ | (uint)fVar221 & uVar44);
            fVar162 = (float)(~uVar45 & (uint)fStack_210 | (uint)fVar223 & uVar45);
            fVar195 = (float)(~uVar47 & (uint)fStack_20c | (uint)fVar244 & uVar47);
            fVar119 = auVar217._0_4_;
            fVar109 = auVar217._4_4_;
            fVar50 = auVar217._8_4_;
            fVar85 = auVar217._12_4_;
            auVar145._0_4_ = fVar125 * fVar125 + fVar119 * fVar119;
            auVar145._4_4_ = fVar140 * fVar140 + fVar109 * fVar109;
            auVar145._8_4_ = fVar231 * fVar231 + fVar50 * fVar50;
            auVar145._12_4_ = fVar232 * fVar232 + fVar85 * fVar85;
            auVar133 = rsqrtps(auVar158,auVar145);
            fVar86 = auVar133._0_4_;
            fVar87 = auVar133._4_4_;
            fVar108 = auVar133._8_4_;
            fVar110 = auVar133._12_4_;
            auVar159._0_4_ = fVar86 * fVar86 * auVar145._0_4_ * 0.5 * fVar86;
            auVar159._4_4_ = fVar87 * fVar87 * auVar145._4_4_ * 0.5 * fVar87;
            auVar159._8_4_ = fVar108 * fVar108 * auVar145._8_4_ * 0.5 * fVar108;
            auVar159._12_4_ = fVar110 * fVar110 * auVar145._12_4_ * 0.5 * fVar110;
            fVar141 = fVar86 * 1.5 - auVar159._0_4_;
            fVar149 = fVar87 * 1.5 - auVar159._4_4_;
            fVar150 = fVar108 * 1.5 - auVar159._8_4_;
            fVar151 = fVar110 * 1.5 - auVar159._12_4_;
            auVar146._0_4_ = fVar111 * fVar111 + fVar218 * fVar218;
            auVar146._4_4_ = fVar161 * fVar161 + fVar220 * fVar220;
            auVar146._8_4_ = fVar162 * fVar162 + fVar222 * fVar222;
            auVar146._12_4_ = fVar195 * fVar195 + fVar224 * fVar224;
            auVar133 = rsqrtps(auVar159,auVar146);
            fVar86 = auVar133._0_4_;
            fVar87 = auVar133._4_4_;
            fVar108 = auVar133._8_4_;
            fVar110 = auVar133._12_4_;
            fVar121 = fVar86 * 1.5 - fVar86 * fVar86 * auVar146._0_4_ * 0.5 * fVar86;
            fVar87 = fVar87 * 1.5 - fVar87 * fVar87 * auVar146._4_4_ * 0.5 * fVar87;
            fVar139 = fVar108 * 1.5 - fVar108 * fVar108 * auVar146._8_4_ * 0.5 * fVar108;
            fVar110 = fVar110 * 1.5 - fVar110 * fVar110 * auVar146._12_4_ * 0.5 * fVar110;
            fVar205 = fVar125 * fVar141 * (float)local_3c8._0_4_;
            fVar206 = fVar140 * fVar149 * (float)local_3c8._4_4_;
            fVar209 = fVar231 * fVar150 * fStack_3c0;
            fVar210 = fVar232 * fVar151 * fStack_3bc;
            fVar108 = -fVar119 * fVar141 * (float)local_3c8._0_4_;
            fVar119 = -fVar109 * fVar149 * (float)local_3c8._4_4_;
            fVar125 = -fVar50 * fVar150 * fStack_3c0;
            fVar140 = -fVar85 * fVar151 * fStack_3bc;
            fVar160 = fVar141 * 0.0 * (float)local_3c8._0_4_;
            fVar123 = fVar149 * 0.0 * (float)local_3c8._4_4_;
            fVar198 = fVar150 * 0.0 * fStack_3c0;
            fVar204 = fVar151 * 0.0 * fStack_3bc;
            local_2c8 = fVar243 + fVar160;
            fStack_2c4 = fVar245 + fVar123;
            fStack_2c0 = fVar247 + fVar198;
            fStack_2bc = fVar249 + fVar204;
            fVar120 = fVar111 * fVar121 * local_2b8._0_4_;
            fVar122 = fVar161 * fVar87 * local_2b8._4_4_;
            fVar124 = fVar162 * fVar139 * local_2b8._8_4_;
            fVar175 = fVar195 * fVar110 * local_2b8._12_4_;
            fVar211 = (float)local_318._0_4_ + fVar120;
            fVar212 = (float)local_318._4_4_ + fVar122;
            fVar213 = fStack_310 + fVar124;
            fVar214 = fStack_30c + fVar175;
            fVar109 = -fVar218 * fVar121 * local_2b8._0_4_;
            fVar50 = -fVar220 * fVar87 * local_2b8._4_4_;
            fVar85 = -fVar222 * fVar139 * local_2b8._8_4_;
            fVar86 = -fVar224 * fVar110 * local_2b8._12_4_;
            fVar218 = fVar170 + fVar109;
            fVar220 = fVar171 + fVar50;
            fVar222 = fVar174 + fVar85;
            fVar224 = fVar193 + fVar86;
            fVar141 = fVar121 * 0.0 * local_2b8._0_4_;
            fVar149 = fVar87 * 0.0 * local_2b8._4_4_;
            fVar150 = fVar139 * 0.0 * local_2b8._8_4_;
            fVar151 = fVar110 * 0.0 * local_2b8._12_4_;
            fVar87 = local_1c8 - fVar205;
            fVar110 = fStack_1c4 - fVar206;
            fVar121 = fStack_1c0 - fVar209;
            fVar139 = fStack_1bc - fVar210;
            fVar231 = fVar239 + fVar141;
            fVar232 = fVar240 + fVar149;
            fVar233 = fVar172 + fVar150;
            fVar234 = fVar173 + fVar151;
            fVar111 = local_1b8 - fVar108;
            fVar161 = fStack_1b4 - fVar119;
            fVar162 = fStack_1b0 - fVar125;
            fVar195 = fStack_1ac - fVar140;
            fVar243 = fVar243 - fVar160;
            fVar245 = fVar245 - fVar123;
            fVar247 = fVar247 - fVar198;
            fVar249 = fVar249 - fVar204;
            uVar43 = -(uint)(0.0 < (fVar111 * (fVar231 - fVar243) - fVar243 * (fVar218 - fVar111)) *
                                   0.0 + (fVar243 * (fVar211 - fVar87) -
                                         (fVar231 - fVar243) * fVar87) * 0.0 +
                                         ((fVar218 - fVar111) * fVar87 -
                                         (fVar211 - fVar87) * fVar111));
            uVar44 = -(uint)(0.0 < (fVar161 * (fVar232 - fVar245) - fVar245 * (fVar220 - fVar161)) *
                                   0.0 + (fVar245 * (fVar212 - fVar110) -
                                         (fVar232 - fVar245) * fVar110) * 0.0 +
                                         ((fVar220 - fVar161) * fVar110 -
                                         (fVar212 - fVar110) * fVar161));
            uVar45 = -(uint)(0.0 < (fVar162 * (fVar233 - fVar247) - fVar247 * (fVar222 - fVar162)) *
                                   0.0 + (fVar247 * (fVar213 - fVar121) -
                                         (fVar233 - fVar247) * fVar121) * 0.0 +
                                         ((fVar222 - fVar162) * fVar121 -
                                         (fVar213 - fVar121) * fVar162));
            uVar47 = -(uint)(0.0 < (fVar195 * (fVar234 - fVar249) - fVar249 * (fVar224 - fVar195)) *
                                   0.0 + (fVar249 * (fVar214 - fVar139) -
                                         (fVar234 - fVar249) * fVar139) * 0.0 +
                                         ((fVar224 - fVar195) * fVar139 -
                                         (fVar214 - fVar139) * fVar195));
            fVar205 = (float)((uint)((float)local_318._0_4_ - fVar120) & uVar43 |
                             ~uVar43 & (uint)(local_1c8 + fVar205));
            fVar206 = (float)((uint)((float)local_318._4_4_ - fVar122) & uVar44 |
                             ~uVar44 & (uint)(fStack_1c4 + fVar206));
            fVar209 = (float)((uint)(fStack_310 - fVar124) & uVar45 |
                             ~uVar45 & (uint)(fStack_1c0 + fVar209));
            fVar210 = (float)((uint)(fStack_30c - fVar175) & uVar47 |
                             ~uVar47 & (uint)(fStack_1bc + fVar210));
            local_448._0_4_ =
                 (float)((uint)(fVar170 - fVar109) & uVar43 | ~uVar43 & (uint)(local_1b8 + fVar108))
            ;
            local_448._4_4_ =
                 (float)((uint)(fVar171 - fVar50) & uVar44 | ~uVar44 & (uint)(fStack_1b4 + fVar119))
            ;
            fStack_440 = (float)((uint)(fVar174 - fVar85) & uVar45 |
                                ~uVar45 & (uint)(fStack_1b0 + fVar125));
            aStack_43c.field_0.x =
                 (float)((uint)(fVar193 - fVar86) & uVar47 | ~uVar47 & (uint)(fStack_1ac + fVar140))
            ;
            fVar141 = (float)((uint)(fVar239 - fVar141) & uVar43 | ~uVar43 & (uint)local_2c8);
            fVar149 = (float)((uint)(fVar240 - fVar149) & uVar44 | ~uVar44 & (uint)fStack_2c4);
            fVar150 = (float)((uint)(fVar172 - fVar150) & uVar45 | ~uVar45 & (uint)fStack_2c0);
            fVar151 = (float)((uint)(fVar173 - fVar151) & uVar47 | ~uVar47 & (uint)fStack_2bc);
            fVar108 = (float)((uint)fVar87 & uVar43 | ~uVar43 & (uint)fVar211);
            fVar119 = (float)((uint)fVar110 & uVar44 | ~uVar44 & (uint)fVar212);
            fVar125 = (float)((uint)fVar121 & uVar45 | ~uVar45 & (uint)fVar213);
            fVar140 = (float)((uint)fVar139 & uVar47 | ~uVar47 & (uint)fVar214);
            fVar160 = (float)((uint)fVar111 & uVar43 | ~uVar43 & (uint)fVar218);
            fVar123 = (float)((uint)fVar161 & uVar44 | ~uVar44 & (uint)fVar220);
            fVar170 = (float)((uint)fVar162 & uVar45 | ~uVar45 & (uint)fVar222);
            fVar171 = (float)((uint)fVar195 & uVar47 | ~uVar47 & (uint)fVar224);
            fVar174 = (float)((uint)fVar243 & uVar43 | ~uVar43 & (uint)fVar231);
            fVar193 = (float)((uint)fVar245 & uVar44 | ~uVar44 & (uint)fVar232);
            fVar198 = (float)((uint)fVar247 & uVar45 | ~uVar45 & (uint)fVar233);
            fVar204 = (float)((uint)fVar249 & uVar47 | ~uVar47 & (uint)fVar234);
            fVar211 = (float)((uint)fVar211 & uVar43 | ~uVar43 & (uint)fVar87) - fVar205;
            fVar212 = (float)((uint)fVar212 & uVar44 | ~uVar44 & (uint)fVar110) - fVar206;
            fVar213 = (float)((uint)fVar213 & uVar45 | ~uVar45 & (uint)fVar121) - fVar209;
            fVar214 = (float)((uint)fVar214 & uVar47 | ~uVar47 & (uint)fVar139) - fVar210;
            fVar111 = (float)((uint)fVar218 & uVar43 | ~uVar43 & (uint)fVar111) - (float)local_448;
            fVar161 = (float)((uint)fVar220 & uVar44 | ~uVar44 & (uint)fVar161) - local_448._4_4_;
            fVar162 = (float)((uint)fVar222 & uVar45 | ~uVar45 & (uint)fVar162) - fStack_440;
            fVar195 = (float)((uint)fVar224 & uVar47 | ~uVar47 & (uint)fVar195) -
                      aStack_43c.field_0.x;
            fVar218 = (float)((uint)fVar231 & uVar43 | ~uVar43 & (uint)fVar243) - fVar141;
            fVar220 = (float)((uint)fVar232 & uVar44 | ~uVar44 & (uint)fVar245) - fVar149;
            fVar222 = (float)((uint)fVar233 & uVar45 | ~uVar45 & (uint)fVar247) - fVar150;
            fVar224 = (float)((uint)fVar234 & uVar47 | ~uVar47 & (uint)fVar249) - fVar151;
            fVar239 = fVar205 - fVar108;
            fVar240 = fVar206 - fVar119;
            fVar172 = fVar209 - fVar125;
            fVar173 = fVar210 - fVar140;
            fVar109 = (float)local_448 - fVar160;
            fVar50 = local_448._4_4_ - fVar123;
            fVar85 = fStack_440 - fVar170;
            fVar86 = aStack_43c.field_0.x - fVar171;
            fVar87 = fVar141 - fVar174;
            fVar110 = fVar149 - fVar193;
            fVar121 = fVar150 - fVar198;
            fVar139 = fVar151 - fVar204;
            fVar231 = ((float)local_448 * fVar218 - fVar141 * fVar111) * 0.0 +
                      (fVar141 * fVar211 - fVar205 * fVar218) * 0.0 +
                      (fVar205 * fVar111 - (float)local_448 * fVar211);
            fVar232 = (local_448._4_4_ * fVar220 - fVar149 * fVar161) * 0.0 +
                      (fVar149 * fVar212 - fVar206 * fVar220) * 0.0 +
                      (fVar206 * fVar161 - local_448._4_4_ * fVar212);
            auVar134._4_4_ = fVar232;
            auVar134._0_4_ = fVar231;
            fVar233 = (fStack_440 * fVar222 - fVar150 * fVar162) * 0.0 +
                      (fVar150 * fVar213 - fVar209 * fVar222) * 0.0 +
                      (fVar209 * fVar162 - fStack_440 * fVar213);
            fVar234 = (aStack_43c.field_0.x * fVar224 - fVar151 * fVar195) * 0.0 +
                      (fVar151 * fVar214 - fVar210 * fVar224) * 0.0 +
                      (fVar210 * fVar195 - aStack_43c.field_0.x * fVar214);
            auVar242._0_4_ =
                 (fVar160 * fVar87 - fVar174 * fVar109) * 0.0 +
                 (fVar174 * fVar239 - fVar108 * fVar87) * 0.0 +
                 (fVar108 * fVar109 - fVar160 * fVar239);
            auVar242._4_4_ =
                 (fVar123 * fVar110 - fVar193 * fVar50) * 0.0 +
                 (fVar193 * fVar240 - fVar119 * fVar110) * 0.0 +
                 (fVar119 * fVar50 - fVar123 * fVar240);
            auVar242._8_4_ =
                 (fVar170 * fVar121 - fVar198 * fVar85) * 0.0 +
                 (fVar198 * fVar172 - fVar125 * fVar121) * 0.0 +
                 (fVar125 * fVar85 - fVar170 * fVar172);
            auVar242._12_4_ =
                 (fVar171 * fVar139 - fVar204 * fVar86) * 0.0 +
                 (fVar204 * fVar173 - fVar140 * fVar139) * 0.0 +
                 (fVar140 * fVar86 - fVar171 * fVar173);
            auVar134._8_4_ = fVar233;
            auVar134._12_4_ = fVar234;
            auVar133 = maxps(auVar134,auVar242);
            bVar27 = auVar133._0_4_ <= 0.0 && bVar27;
            auVar135._0_4_ = -(uint)bVar27;
            bVar26 = auVar133._4_4_ <= 0.0 && bVar26;
            auVar135._4_4_ = -(uint)bVar26;
            bVar28 = auVar133._8_4_ <= 0.0 && bVar28;
            auVar135._8_4_ = -(uint)bVar28;
            bVar29 = auVar133._12_4_ <= 0.0 && bVar29;
            auVar135._12_4_ = -(uint)bVar29;
            iVar30 = movmskps((int)puVar34,auVar135);
            if (iVar30 == 0) {
LAB_00a84ad3:
              auVar115._8_8_ = uStack_330;
              auVar115._0_8_ = local_338;
            }
            else {
              fVar108 = (ray->super_RayK<1>).tfar;
              fVar125 = fVar109 * fVar218 - fVar87 * fVar111;
              fVar140 = fVar50 * fVar220 - fVar110 * fVar161;
              fVar160 = fVar85 * fVar222 - fVar121 * fVar162;
              fVar123 = fVar86 * fVar224 - fVar139 * fVar195;
              fVar87 = fVar87 * fVar211 - fVar218 * fVar239;
              fVar110 = fVar110 * fVar212 - fVar220 * fVar240;
              fVar119 = fVar121 * fVar213 - fVar222 * fVar172;
              fVar121 = fVar139 * fVar214 - fVar224 * fVar173;
              fVar139 = fVar239 * fVar111 - fVar109 * fVar211;
              fVar111 = fVar240 * fVar161 - fVar50 * fVar212;
              fVar161 = fVar172 * fVar162 - fVar85 * fVar213;
              fVar162 = fVar173 * fVar195 - fVar86 * fVar214;
              auVar114._0_4_ = fVar87 * 0.0 + fVar139;
              auVar114._4_4_ = fVar110 * 0.0 + fVar111;
              auVar114._8_4_ = fVar119 * 0.0 + fVar161;
              auVar114._12_4_ = fVar121 * 0.0 + fVar162;
              auVar169._0_4_ = fVar125 * 0.0 + auVar114._0_4_;
              auVar169._4_4_ = fVar140 * 0.0 + auVar114._4_4_;
              auVar169._8_4_ = fVar160 * 0.0 + auVar114._8_4_;
              auVar169._12_4_ = fVar123 * 0.0 + auVar114._12_4_;
              auVar133 = rcpps(auVar114,auVar169);
              fVar109 = auVar133._0_4_;
              fVar50 = auVar133._4_4_;
              fVar85 = auVar133._8_4_;
              fVar86 = auVar133._12_4_;
              fVar109 = (1.0 - auVar169._0_4_ * fVar109) * fVar109 + fVar109;
              fVar50 = (1.0 - auVar169._4_4_ * fVar50) * fVar50 + fVar50;
              fVar85 = (1.0 - auVar169._8_4_ * fVar85) * fVar85 + fVar85;
              fVar86 = (1.0 - auVar169._12_4_ * fVar86) * fVar86 + fVar86;
              fVar87 = (fVar141 * fVar139 + (float)local_448 * fVar87 + fVar205 * fVar125) * fVar109
              ;
              fVar110 = (fVar149 * fVar111 + local_448._4_4_ * fVar110 + fVar206 * fVar140) * fVar50
              ;
              fVar119 = (fVar150 * fVar161 + fStack_440 * fVar119 + fVar209 * fVar160) * fVar85;
              fVar121 = (fVar151 * fVar162 + aStack_43c.field_0.x * fVar121 + fVar210 * fVar123) *
                        fVar86;
              bVar27 = (local_208 <= fVar87 && fVar87 <= fVar108) && bVar27;
              auVar147._0_4_ = -(uint)bVar27;
              bVar26 = (fStack_204 <= fVar110 && fVar110 <= fVar108) && bVar26;
              auVar147._4_4_ = -(uint)bVar26;
              bVar28 = (fStack_200 <= fVar119 && fVar119 <= fVar108) && bVar28;
              auVar147._8_4_ = -(uint)bVar28;
              bVar29 = (fStack_1fc <= fVar121 && fVar121 <= fVar108) && bVar29;
              auVar147._12_4_ = -(uint)bVar29;
              iVar30 = movmskps(iVar30,auVar147);
              if (iVar30 == 0) goto LAB_00a84ad3;
              auVar148._0_8_ =
                   CONCAT44(-(uint)(auVar169._4_4_ != 0.0 && bVar26),
                            -(uint)(auVar169._0_4_ != 0.0 && bVar27));
              auVar148._8_4_ = -(uint)(auVar169._8_4_ != 0.0 && bVar28);
              auVar148._12_4_ = -(uint)(auVar169._12_4_ != 0.0 && bVar29);
              iVar30 = movmskps(iVar30,auVar148);
              auVar115._8_8_ = uStack_330;
              auVar115._0_8_ = local_338;
              if (iVar30 != 0) {
                fVar231 = fVar231 * fVar109;
                fVar232 = fVar232 * fVar50;
                fVar233 = fVar233 * fVar85;
                fVar234 = fVar234 * fVar86;
                local_78 = (float)((uint)(1.0 - fVar231) & uVar43 | ~uVar43 & (uint)fVar231);
                fStack_74 = (float)((uint)(1.0 - fVar232) & uVar44 | ~uVar44 & (uint)fVar232);
                fStack_70 = (float)((uint)(1.0 - fVar233) & uVar45 | ~uVar45 & (uint)fVar233);
                fStack_6c = (float)((uint)(1.0 - fVar234) & uVar47 | ~uVar47 & (uint)fVar234);
                auVar115._8_4_ = auVar148._8_4_;
                auVar115._0_8_ = auVar148._0_8_;
                auVar115._12_4_ = auVar148._12_4_;
                local_2e8 = fVar87;
                fStack_2e4 = fVar110;
                fStack_2e0 = fVar119;
                fStack_2dc = fVar121;
                local_1f8 = (float)(~uVar43 & (uint)(auVar242._0_4_ * fVar109) |
                                   (uint)(1.0 - auVar242._0_4_ * fVar109) & uVar43);
                fStack_1f4 = (float)(~uVar44 & (uint)(auVar242._4_4_ * fVar50) |
                                    (uint)(1.0 - auVar242._4_4_ * fVar50) & uVar44);
                fStack_1f0 = (float)(~uVar45 & (uint)(auVar242._8_4_ * fVar85) |
                                    (uint)(1.0 - auVar242._8_4_ * fVar85) & uVar45);
                fStack_1ec = (float)(~uVar47 & (uint)(auVar242._12_4_ * fVar86) |
                                    (uint)(1.0 - auVar242._12_4_ * fVar86) & uVar47);
              }
            }
            uVar43 = movmskps(iVar30,auVar115);
            puVar34 = (undefined1 *)(ulong)uVar43;
            if (uVar43 != 0) {
              fVar50 = (local_2b8._0_4_ - (float)local_3c8._0_4_) * local_78 +
                       (float)local_3c8._0_4_;
              fVar85 = (local_2b8._4_4_ - (float)local_3c8._4_4_) * fStack_74 +
                       (float)local_3c8._4_4_;
              fVar86 = (local_2b8._8_4_ - fStack_3c0) * fStack_70 + fStack_3c0;
              fVar87 = (local_2b8._12_4_ - fStack_3bc) * fStack_6c + fStack_3bc;
              fVar109 = pre->depth_scale;
              auVar80._0_4_ = -(uint)(fVar109 * (fVar50 + fVar50) < local_2e8) & auVar115._0_4_;
              auVar80._4_4_ = -(uint)(fVar109 * (fVar85 + fVar85) < fStack_2e4) & auVar115._4_4_;
              auVar80._8_4_ = -(uint)(fVar109 * (fVar86 + fVar86) < fStack_2e0) & auVar115._8_4_;
              auVar80._12_4_ = -(uint)(fVar109 * (fVar87 + fVar87) < fStack_2dc) & auVar115._12_4_;
              uVar43 = movmskps(uVar43,auVar80);
              puVar34 = (undefined1 *)(ulong)uVar43;
              if (uVar43 != 0) {
                local_1f8 = local_1f8 + local_1f8 + -1.0;
                fStack_1f4 = fStack_1f4 + fStack_1f4 + -1.0;
                fStack_1f0 = fStack_1f0 + fStack_1f0 + -1.0;
                fStack_1ec = fStack_1ec + fStack_1ec + -1.0;
                local_198._4_4_ = fStack_74;
                local_198._0_4_ = local_78;
                fStack_190 = fStack_70;
                fStack_18c = fStack_6c;
                local_188 = local_1f8;
                fStack_184 = fStack_1f4;
                fStack_180 = fStack_1f0;
                fStack_17c = fStack_1ec;
                local_178._4_4_ = fStack_2e4;
                local_178._0_4_ = local_2e8;
                fStack_170 = fStack_2e0;
                fStack_16c = fStack_2dc;
                local_164 = iVar6;
                local_158 = CONCAT44(fStack_394,local_398);
                uStack_150 = CONCAT44(fStack_38c,fStack_390);
                local_148 = local_408;
                fStack_144 = fStack_404;
                fStack_140 = fStack_400;
                fStack_13c = fStack_3fc;
                local_138 = local_418;
                fStack_134 = fStack_414;
                fStack_130 = fStack_410;
                fStack_12c = fStack_40c;
                local_128 = CONCAT44(fStack_324,local_328);
                uStack_120 = CONCAT44(fStack_31c,fStack_320);
                local_118 = auVar80;
                pGVar39 = (context->scene->geometries).items[local_420].ptr;
                uVar43 = (ray->super_RayK<1>).mask;
                puVar34 = (undefined1 *)(ulong)uVar43;
                if ((pGVar39->mask & uVar43) != 0) {
                  local_388 = auVar80;
                  fVar109 = (float)(int)local_168;
                  local_108[0] = (fVar109 + local_78 + 0.0) * local_88;
                  local_108[1] = (fVar109 + fStack_74 + 1.0) * fStack_84;
                  local_108[2] = (fVar109 + fStack_70 + 2.0) * fStack_80;
                  local_108[3] = (fVar109 + fStack_6c + 3.0) * fStack_7c;
                  local_f8 = CONCAT44(fStack_1f4,local_1f8);
                  uStack_f0 = CONCAT44(fStack_1ec,fStack_1f0);
                  local_e8._4_4_ = fStack_2e4;
                  local_e8._0_4_ = local_2e8;
                  fStack_e0 = fStack_2e0;
                  fStack_dc = fStack_2dc;
                  auVar99._0_4_ = auVar80._0_4_ & (uint)local_2e8;
                  auVar99._4_4_ = auVar80._4_4_ & (uint)fStack_2e4;
                  auVar99._8_4_ = auVar80._8_4_ & (uint)fStack_2e0;
                  auVar99._12_4_ = auVar80._12_4_ & (uint)fStack_2dc;
                  auVar116._0_8_ = CONCAT44(~auVar80._4_4_,~auVar80._0_4_) & 0x7f8000007f800000;
                  auVar116._8_4_ = ~auVar80._8_4_ & 0x7f800000;
                  auVar116._12_4_ = ~auVar80._12_4_ & 0x7f800000;
                  auVar116 = auVar116 | auVar99;
                  auVar136._4_4_ = auVar116._0_4_;
                  auVar136._0_4_ = auVar116._4_4_;
                  auVar136._8_4_ = auVar116._12_4_;
                  auVar136._12_4_ = auVar116._8_4_;
                  auVar133 = minps(auVar136,auVar116);
                  auVar100._0_8_ = auVar133._8_8_;
                  auVar100._8_4_ = auVar133._0_4_;
                  auVar100._12_4_ = auVar133._4_4_;
                  auVar133 = minps(auVar100,auVar133);
                  auVar101._0_8_ =
                       CONCAT44(-(uint)(auVar133._4_4_ == auVar116._4_4_) & auVar80._4_4_,
                                -(uint)(auVar133._0_4_ == auVar116._0_4_) & auVar80._0_4_);
                  auVar101._8_4_ = -(uint)(auVar133._8_4_ == auVar116._8_4_) & auVar80._8_4_;
                  auVar101._12_4_ = -(uint)(auVar133._12_4_ == auVar116._12_4_) & auVar80._12_4_;
                  iVar30 = movmskps(uVar43,auVar101);
                  if (iVar30 != 0) {
                    auVar80._8_4_ = auVar101._8_4_;
                    auVar80._0_8_ = auVar101._0_8_;
                    auVar80._12_4_ = auVar101._12_4_;
                  }
                  uVar43 = movmskps(iVar30,auVar80);
                  lVar41 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar39->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar109 = local_108[lVar41];
                    fVar85 = 1.0 - fVar109;
                    fVar50 = fVar109 * 3.0;
                    fVar108 = ((fVar50 + 2.0) * (fVar85 + fVar85) + fVar85 * -3.0 * fVar85) * 0.5;
                    fVar86 = (fVar85 * -2.0 * fVar109 + fVar109 * fVar109) * 0.5;
                    fVar87 = (fVar109 * fVar50 + (fVar50 + -5.0) * (fVar109 + fVar109)) * 0.5;
                    fVar50 = *(float *)((long)&local_f8 + lVar41 * 4);
                    fVar85 = (fVar109 * (fVar85 + fVar85) - fVar85 * fVar85) * 0.5;
                    (ray->super_RayK<1>).tfar = *(float *)(local_e8 + lVar41 * 4);
                    *(ulong *)&(ray->Ng).field_0 =
                         CONCAT44(fVar85 * fStack_394 +
                                  fVar87 * fStack_404 + fVar108 * fStack_414 + fVar86 * fStack_324,
                                  fVar85 * local_398 +
                                  fVar87 * local_408 + fVar108 * local_418 + fVar86 * local_328);
                    (ray->Ng).field_0.field_0.z =
                         fVar85 * fStack_390 +
                         fVar87 * fStack_400 + fVar108 * fStack_410 + fVar86 * fStack_320;
                    ray->u = fVar109;
                    ray->v = fVar50;
                    ray->primID = (uint)local_3e0;
                    ray->geomID = (uint)local_420;
                    ray->instID[0] = context->user->instID[0];
                    uVar43 = context->user->instPrimID[0];
                    puVar34 = (undefined1 *)(ulong)uVar43;
                    ray->instPrimID[0] = uVar43;
                    pre = local_378;
                    prim = local_370;
                  }
                  else {
                    _local_488 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
                    local_448 = pGVar39;
                    fVar109 = local_418;
                    fVar50 = fStack_414;
                    fVar85 = fStack_410;
                    fVar86 = local_2e8;
                    fVar87 = fStack_2e4;
                    fVar108 = fStack_2e0;
                    fVar110 = fStack_2dc;
                    fVar119 = local_408;
                    fVar121 = fStack_404;
                    fVar125 = fStack_400;
LAB_00a84b1b:
                    local_23c = local_108[lVar41];
                    local_238 = *(undefined4 *)((long)&local_f8 + lVar41 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_e8 + lVar41 * 4);
                    fVar139 = 1.0 - local_23c;
                    fVar141 = local_23c * 3.0;
                    fVar149 = ((fVar141 + 2.0) * (fVar139 + fVar139) + fVar139 * -3.0 * fVar139) *
                              0.5;
                    fVar140 = (fVar139 * -2.0 * local_23c + local_23c * local_23c) * 0.5;
                    fVar141 = (local_23c * fVar141 + (fVar141 + -5.0) * (local_23c + local_23c)) *
                              0.5;
                    fVar139 = (local_23c * (fVar139 + fVar139) - fVar139 * fVar139) * 0.5;
                    local_368.context = context->user;
                    local_248 = CONCAT44(fVar139 * fStack_394 +
                                         fVar141 * fVar121 + fVar149 * fVar50 + fVar140 * fStack_324
                                         ,fVar139 * local_398 +
                                          fVar141 * fVar119 +
                                          fVar149 * fVar109 + fVar140 * local_328);
                    local_240 = fVar139 * fStack_390 +
                                fVar141 * fVar125 + fVar149 * fVar85 + fVar140 * fStack_320;
                    local_234 = (int)local_3e0;
                    local_230 = (int)local_420;
                    local_22c = (local_368.context)->instID[0];
                    local_228 = (local_368.context)->instPrimID[0];
                    local_46c._0_4_ = -NAN;
                    local_368.valid = (int *)local_46c;
                    local_368.geometryUserPtr = pGVar39->userPtr;
                    local_368.ray = (RTCRayN *)ray;
                    local_368.hit = (RTCHitN *)&local_248;
                    local_368.N = 1;
                    if ((pGVar39->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar39->intersectionFilterN)(&local_368), p_Var37 = extraout_RDX,
                       pGVar39 = local_448, context = local_3e8, fVar109 = local_418,
                       fVar50 = fStack_414, fVar85 = fStack_410, fVar86 = local_2e8,
                       fVar87 = fStack_2e4, fVar108 = fStack_2e0, fVar110 = fStack_2dc,
                       fVar119 = local_408, fVar121 = fStack_404, fVar125 = fStack_400,
                       (((RayK<1> *)local_368.valid)->org).field_0.m128[0] != 0.0)) {
                      p_Var37 = context->args->filter;
                      if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                            RTC_RAY_QUERY_FLAG_INCOHERENT ||
                           (((pGVar39->field_8).field_0x2 & 0x40) != 0)) &&
                          ((*p_Var37)(&local_368), p_Var37 = extraout_RDX_00, pGVar39 = local_448,
                          context = local_3e8, fVar109 = local_418, fVar50 = fStack_414,
                          fVar85 = fStack_410, fVar86 = local_2e8, fVar87 = fStack_2e4,
                          fVar108 = fStack_2e0, fVar110 = fStack_2dc, fVar119 = local_408,
                          fVar121 = fStack_404, fVar125 = fStack_400,
                          (((RayK<1> *)local_368.valid)->org).field_0.m128[0] == 0.0))))
                      goto LAB_00a84dac;
                      (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_368.hit;
                      (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_368.hit + 4);
                      (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_368.hit + 8);
                      *(float *)((long)local_368.ray + 0x3c) = *(float *)(local_368.hit + 0xc);
                      *(float *)((long)local_368.ray + 0x40) = *(float *)(local_368.hit + 0x10);
                      *(float *)((long)local_368.ray + 0x44) = *(float *)(local_368.hit + 0x14);
                      *(float *)((long)local_368.ray + 0x48) = *(float *)(local_368.hit + 0x18);
                      p_Var37 = (RTCFilterFunctionN)(ulong)(uint)*(float *)(local_368.hit + 0x1c);
                      *(float *)((long)local_368.ray + 0x4c) = *(float *)(local_368.hit + 0x1c);
                      *(float *)((long)local_368.ray + 0x50) = *(float *)(local_368.hit + 0x20);
                      pRVar35 = (RayHit *)local_368.ray;
                    }
                    else {
LAB_00a84dac:
                      (ray->super_RayK<1>).tfar = (float)local_488._0_4_;
                      pRVar35 = (RayHit *)local_368.valid;
                      pGVar39 = local_448;
                      context = local_3e8;
                      fVar109 = local_418;
                      fVar50 = fStack_414;
                      fVar85 = fStack_410;
                      fVar86 = local_2e8;
                      fVar87 = fStack_2e4;
                      fVar108 = fStack_2e0;
                      fVar110 = fStack_2dc;
                      fVar119 = local_408;
                      fVar121 = fStack_404;
                      fVar125 = fStack_400;
                    }
                    *(undefined4 *)(local_388 + lVar41 * 4) = 0;
                    fVar139 = (ray->super_RayK<1>).tfar;
                    local_488._0_4_ = (ray->super_RayK<1>).tfar;
                    local_488._4_4_ = (ray->super_RayK<1>).mask;
                    fStack_480 = (float)(ray->super_RayK<1>).id;
                    fStack_47c = (float)(ray->super_RayK<1>).flags;
                    auVar81._0_4_ = -(uint)(fVar86 <= fVar139) & local_388._0_4_;
                    auVar81._4_4_ = -(uint)(fVar87 <= fVar139) & local_388._4_4_;
                    auVar81._8_4_ = -(uint)(fVar108 <= fVar139) & local_388._8_4_;
                    auVar81._12_4_ = -(uint)(fVar110 <= fVar139) & local_388._12_4_;
                    local_388 = auVar81;
                    uVar32 = (undefined4)((ulong)pRVar35 >> 0x20);
                    iVar30 = movmskps((int)pRVar35,auVar81);
                    puVar34 = (undefined1 *)CONCAT44(uVar32,iVar30);
                    pre = local_378;
                    prim = local_370;
                    if (iVar30 != 0) {
                      auVar102._0_4_ = auVar81._0_4_ & (uint)fVar86;
                      auVar102._4_4_ = auVar81._4_4_ & (uint)fVar87;
                      auVar102._8_4_ = auVar81._8_4_ & (uint)fVar108;
                      auVar102._12_4_ = auVar81._12_4_ & (uint)fVar110;
                      auVar117._0_8_ = CONCAT44(~auVar81._4_4_,~auVar81._0_4_) & 0x7f8000007f800000;
                      auVar117._8_4_ = ~auVar81._8_4_ & 0x7f800000;
                      auVar117._12_4_ = ~auVar81._12_4_ & 0x7f800000;
                      auVar117 = auVar117 | auVar102;
                      auVar137._4_4_ = auVar117._0_4_;
                      auVar137._0_4_ = auVar117._4_4_;
                      auVar137._8_4_ = auVar117._12_4_;
                      auVar137._12_4_ = auVar117._8_4_;
                      auVar133 = minps(auVar137,auVar117);
                      auVar103._0_8_ = auVar133._8_8_;
                      auVar103._8_4_ = auVar133._0_4_;
                      auVar103._12_4_ = auVar133._4_4_;
                      auVar133 = minps(auVar103,auVar133);
                      auVar104._0_8_ =
                           CONCAT44(-(uint)(auVar133._4_4_ == auVar117._4_4_) & auVar81._4_4_,
                                    -(uint)(auVar133._0_4_ == auVar117._0_4_) & auVar81._0_4_);
                      auVar104._8_4_ = -(uint)(auVar133._8_4_ == auVar117._8_4_) & auVar81._8_4_;
                      auVar104._12_4_ = -(uint)(auVar133._12_4_ == auVar117._12_4_) & auVar81._12_4_
                      ;
                      iVar30 = movmskps(iVar30,auVar104);
                      if (iVar30 != 0) {
                        auVar81._8_4_ = auVar104._8_4_;
                        auVar81._0_8_ = auVar104._0_8_;
                        auVar81._12_4_ = auVar104._12_4_;
                      }
                      uVar31 = movmskps(iVar30,auVar81);
                      uVar40 = CONCAT44(uVar32,uVar31);
                      lVar41 = 0;
                      if (uVar40 != 0) {
                        for (; (uVar40 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                        }
                      }
                      goto LAB_00a84b1b;
                    }
                  }
                }
              }
            }
          }
          uVar45 = (uint)puVar34;
          lVar38 = lVar38 + 4;
        } while ((int)lVar38 < iVar6);
      }
      fVar109 = (ray->super_RayK<1>).tfar;
      auVar98._4_4_ = -(uint)(fStack_44 <= fVar109);
      auVar98._0_4_ = -(uint)(local_48 <= fVar109);
      auVar98._8_4_ = -(uint)(fStack_40 <= fVar109);
      auVar98._12_4_ = -(uint)(fStack_3c <= fVar109);
      uVar43 = movmskps(uVar45,auVar98);
      uVar43 = (uint)uVar42 & uVar43;
      auVar133 = local_46c._4_16_;
      auVar229 = local_458;
    } while (uVar43 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }